

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O1

bool __thiscall
duckdb::CSVSniffer::CanYouCastIt
          (CSVSniffer *this,ClientContext *context,string_t value,LogicalType *type,
          DialectOptions *dialect_options,bool is_null,char decimal_separator,
          char thousands_separator)

{
  PhysicalType PVar1;
  undefined1 auVar2 [12];
  byte bVar3;
  string_t val;
  string_t input;
  string_t input_00;
  bool bVar4;
  DateCastResult DVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var9;
  byte *pbVar10;
  InvalidInputException *this_00;
  InternalException *pIVar11;
  LogicalType *this_01;
  char *pcVar12;
  BaseScanner *pBVar13;
  ulong uVar14;
  PhysicalType type_00;
  PhysicalType type_01;
  short sVar15;
  int iVar16;
  BaseScanner *this_02;
  char cVar17;
  ushort uVar18;
  ulong uVar19;
  char *pcVar20;
  short sVar21;
  int iVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  long lVar24;
  ulong uVar25;
  byte bVar26;
  LogicalType *pLVar27;
  char cVar28;
  byte bVar29;
  char *pcVar30;
  uint uVar31;
  uint uVar32;
  char *pcVar33;
  char *pcVar34;
  long lVar35;
  char *pcVar36;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var37;
  char *pcVar38;
  char *pcVar39;
  bool bVar40;
  from_chars_result fVar41;
  uint8_t scale;
  date_t dummy_value_2;
  bool special;
  string strip_thousands;
  uint8_t local_129;
  Value local_128;
  ClientContext *local_e0;
  BaseScanner *local_d8;
  Value local_d0;
  string local_90;
  char *local_70;
  BaseScanner *local_68;
  char *local_60;
  undefined1 local_58 [40];
  
  this_01 = value.value._8_8_;
  local_d8 = value.value._0_8_;
  if ((int)dialect_options != 0) {
    return true;
  }
  pcVar34 = (char *)((ulong)context & 0xffffffff);
  this_02 = local_d8;
  if (pcVar34 < (char *)0xd) {
    this_02 = (BaseScanner *)((long)&local_e0 + 4);
  }
  local_68 = (BaseScanner *)local_58;
  local_60 = (char *)0x0;
  local_58[0] = 0;
  pLVar27 = type;
  local_e0 = context;
  bVar4 = LogicalType::IsNumeric(this_01);
  if (bVar4 && decimal_separator != '\0') {
    BaseScanner::RemoveSeparator_abi_cxx11_
              ((string *)&local_128,this_02,pcVar34,(ulong)(uint)(int)decimal_separator,
               (char)pLVar27);
    ::std::__cxx11::string::operator=((string *)&local_68,(string *)&local_128);
    this_02 = local_68;
    pcVar34 = local_60;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_128.type_._0_8_ !=
        &local_128.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_128.type_._0_8_);
      this_02 = local_68;
      pcVar34 = local_60;
    }
  }
  switch(this_01->id_) {
  case BOOLEAN:
    switch(pcVar34) {
    case (char *)0x1:
      iVar22 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      bVar4 = (char)iVar22 == 'f' || (char)iVar22 == 't';
      goto LAB_0152fa07;
    case (char *)0x2:
      uVar31 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      uVar32 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 1));
      bVar4 = (uVar32 & 0xff) == 0x6f && (uVar31 & 0xff) == 0x6e;
      goto LAB_0152fa07;
    case (char *)0x3:
      uVar31 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      uVar32 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 1));
      iVar22 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 2));
      uVar31 = uVar32 & 0xff ^ 0x65 | uVar31 & 0xff ^ 0x79;
      bVar4 = (char)iVar22 == 's';
LAB_0152c1e1:
      bVar40 = uVar31 == 0;
      break;
    case (char *)0x4:
      uVar31 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      uVar32 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 1));
      iVar22 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 2));
      iVar16 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 3));
      bVar40 = (uVar32 & 0xff) == 0x72 && (uVar31 & 0xff) == 0x74;
      bVar4 = (char)iVar16 == 'e' && (char)iVar22 == 'u';
      break;
    case (char *)0x5:
      uVar31 = tolower((int)*(char *)&this_02->_vptr_BaseScanner);
      uVar32 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 1));
      iVar22 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 2));
      iVar16 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 3));
      iVar6 = tolower((int)*(char *)((long)&this_02->_vptr_BaseScanner + 4));
      bVar40 = (uVar32 & 0xff) == 0x61 && (uVar31 & 0xff) == 0x66;
      bVar4 = (char)iVar6 == 'e' && ((char)iVar16 == 's' && (char)iVar22 == 'l');
      break;
    default:
      goto switchD_0152b780_default;
    }
    bVar4 = (bool)(bVar4 & bVar40);
    goto LAB_0152fa07;
  case TINYINT:
    if (pcVar34 != (char *)0x0) {
      pcVar12 = (char *)0x0;
      bVar4 = true;
      do {
        bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
        uVar31 = (uint)bVar26;
        if ((4 < uVar31 - 9) && (uVar31 != 0x20)) {
          if (uVar31 == 0x2d) {
            pcVar36 = pcVar34 + -(long)pcVar12;
            pcVar20 = &DAT_00000001;
            cVar17 = '\0';
            goto LAB_0152babe;
          }
          if ((pcVar34 + -1 != pcVar12) && (bVar26 == 0x30)) {
            bVar29 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
            if (bVar29 < 0x62) {
              if (bVar29 == 0x42) {
LAB_0152d4d9:
                pcVar20 = pcVar34 + ~(ulong)pcVar12;
                bVar40 = pcVar20 >= (char *)0x2;
                if (pcVar20 < (char *)0x2) goto LAB_0152f5f8;
                pcVar36 = &DAT_00000001;
                bVar26 = 0;
                goto LAB_0152d4f6;
              }
              if (bVar29 == 0x58) {
LAB_0152cef1:
                cVar17 = '\0';
                pcVar20 = &DAT_00000001;
                goto LAB_0152cf0b;
              }
            }
            else {
              if (bVar29 == 0x62) goto LAB_0152d4d9;
              if (bVar29 == 0x78) goto LAB_0152cef1;
            }
          }
          uVar14 = (long)pcVar34 - (long)pcVar12;
          uVar19 = (ulong)(bVar26 == 0x2b);
          cVar17 = '\0';
          uVar8 = uVar19;
          goto LAB_0152c42f;
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar34 != pcVar12);
      goto LAB_0152f600;
    }
    break;
  case SMALLINT:
    if (pcVar34 != (char *)0x0) {
      pcVar12 = (char *)0x0;
      do {
        bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
        if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
          local_d0.type_.id_ = INVALID;
          local_d0.type_.physical_type_ = ~INVALID;
          if (bVar26 == 0x2d) {
            bVar40 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar12 + (long)(&this_02->states + -0x20),
                                (long)pcVar34 - (long)pcVar12,(IntegerCastData<short> *)&local_d0,
                                true);
            goto LAB_0152c61d;
          }
          if ((pcVar34 + -1 != pcVar12) && (bVar26 == 0x30)) {
            bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
            if (bVar26 < 0x62) {
              if (bVar26 == 0x42) {
LAB_0152e467:
                pcVar20 = pcVar34 + ~(ulong)pcVar12;
                bVar40 = pcVar20 >= (char *)0x2;
                if (pcVar20 < (char *)0x2) goto LAB_0152c61d;
                pcVar36 = &DAT_00000001;
                local_d0.type_._0_2_ = 0;
                goto LAB_0152e484;
              }
              if (bVar26 == 0x58) {
LAB_0152e344:
                iVar16 = 0;
                iVar22 = 0;
                pcVar20 = &DAT_00000001;
                goto LAB_0152e361;
              }
            }
            else {
              if (bVar26 == 0x62) goto LAB_0152e467;
              if (bVar26 == 0x78) goto LAB_0152e344;
            }
            if ((byte)(bVar26 - 0x30) < 10) break;
          }
          bVar40 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar12 + (long)(&this_02->states + -0x20),
                              (long)pcVar34 - (long)pcVar12,(IntegerCastData<short> *)&local_d0,true
                             );
          goto LAB_0152c61d;
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar34 != pcVar12);
      goto joined_r0x0152c62b;
    }
    break;
  case INTEGER:
    if (pcVar34 != (char *)0x0) {
      bVar4 = true;
      pcVar12 = pcVar34;
      pBVar13 = this_02;
      do {
        bVar26 = *(byte *)&pBVar13->_vptr_BaseScanner;
        if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
          if (bVar26 == 0x2d) {
            pcVar36 = &DAT_00000001;
            pcVar20 = pcVar36;
            if (pcVar12 == &DAT_00000001) goto LAB_0152cb91;
            iVar22 = 0;
            lVar35 = -2;
            goto LAB_0152bda9;
          }
          if ((pcVar12 == &DAT_00000001) || (bVar26 != 0x30)) {
            if (bVar26 == 0x2b) break;
          }
          else {
            bVar26 = *(byte *)((long)&pBVar13->_vptr_BaseScanner + 1);
            if (bVar26 < 0x62) {
              if (bVar26 == 0x42) {
LAB_0152d676:
                pcVar12 = pcVar12 + -1;
                bVar40 = pcVar12 >= (char *)0x2;
                if (pcVar12 < (char *)0x2) goto LAB_0152e19f;
                pcVar20 = &DAT_00000001;
                iVar22 = 0;
                goto LAB_0152d68d;
              }
              if (bVar26 == 0x58) {
LAB_0152d231:
                pcVar12 = pcVar12 + -1;
                pcVar20 = &DAT_00000001;
                iVar22 = 0;
                goto LAB_0152d245;
              }
            }
            else {
              if (bVar26 == 0x62) goto LAB_0152d676;
              if (bVar26 == 0x78) goto LAB_0152d231;
            }
            if ((byte)(bVar26 - 0x30) < 10) break;
          }
          iVar22 = 0;
          lVar35 = -1;
          pcVar20 = (char *)0x0;
          goto LAB_0152c925;
        }
        pBVar13 = (BaseScanner *)((long)&pBVar13->_vptr_BaseScanner + 1);
        pcVar12 = pcVar12 + -1;
      } while (pcVar12 != (char *)0x0);
      goto joined_r0x0152e1aa;
    }
    break;
  case BIGINT:
    if (pcVar34 != (char *)0x0) {
      bVar4 = true;
      pcVar12 = pcVar34;
      pBVar13 = this_02;
      do {
        bVar26 = *(byte *)&pBVar13->_vptr_BaseScanner;
        if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
          if (bVar26 == 0x2d) {
            pcVar20 = &DAT_00000001;
            if (pcVar12 == &DAT_00000001) goto LAB_0152cb45;
            pcVar36 = &DAT_00000001;
            lVar35 = -2;
            lVar24 = 0;
            goto LAB_0152b9ad;
          }
          if ((pcVar12 == &DAT_00000001) || (bVar26 != 0x30)) {
            if (bVar26 == 0x2b) break;
          }
          else {
            bVar26 = *(byte *)((long)&pBVar13->_vptr_BaseScanner + 1);
            if (bVar26 < 0x62) {
              if (bVar26 == 0x42) {
LAB_0152d449:
                pcVar12 = pcVar12 + -1;
                bVar40 = pcVar12 >= (char *)0x2;
                if (pcVar12 < (char *)0x2) goto LAB_0152dc13;
                pcVar20 = &DAT_00000001;
                lVar35 = 0;
                goto LAB_0152d46a;
              }
              if (bVar26 == 0x58) {
LAB_0152cdd5:
                pcVar12 = pcVar12 + -1;
                pcVar20 = &DAT_00000001;
                lVar35 = 0;
                goto LAB_0152cdf4;
              }
            }
            else {
              if (bVar26 == 0x62) goto LAB_0152d449;
              if (bVar26 == 0x78) goto LAB_0152cdd5;
            }
            if ((byte)(bVar26 - 0x30) < 10) break;
          }
          lVar24 = -1;
          lVar35 = 0;
          pcVar20 = (char *)0x0;
          goto LAB_0152c7fe;
        }
        pBVar13 = (BaseScanner *)((long)&pBVar13->_vptr_BaseScanner + 1);
        pcVar12 = pcVar12 + -1;
      } while (pcVar12 != (char *)0x0);
      goto joined_r0x0152dc1e;
    }
    break;
  case DATE:
    p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&type[3].type_info_;
    p_Var7 = p_Var37;
    for (p_Var23 = type[3].type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi; p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (&p_Var23[1]._vptr__Sp_counted_base)[bVar4]) {
      bVar4 = *(byte *)&p_Var23[2]._vptr__Sp_counted_base < 0xf;
      if (!bVar4) {
        p_Var7 = p_Var23;
      }
    }
    p_Var23 = p_Var37;
    if ((p_Var7 != p_Var37) && (p_Var23 = p_Var7, 0xf < *(byte *)&p_Var7[2]._vptr__Sp_counted_base))
    {
      p_Var23 = p_Var37;
    }
    bVar4 = StrTimeFormat::Empty((StrTimeFormat *)(p_Var23 + 3));
    if (!bVar4) {
      local_128.type_._0_8_ =
           &local_128.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_128.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffffffffff00;
      p_Var7 = p_Var37;
      for (p_Var23 = type[3].type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (&p_Var23[1]._vptr__Sp_counted_base)[bVar4]) {
        bVar4 = *(byte *)&p_Var23[2]._vptr__Sp_counted_base < 0xf;
        if (!bVar4) {
          p_Var7 = p_Var23;
        }
      }
      if ((p_Var7 != p_Var37) && (*(byte *)&p_Var7[2]._vptr__Sp_counted_base < 0x10)) {
        p_Var37 = p_Var7;
      }
      input.value.pointer.ptr = (char *)local_d8;
      input.value._0_8_ = local_e0;
      bVar4 = StrpTimeFormat::TryParseDate
                        ((StrpTimeFormat *)(p_Var37 + 3),input,(date_t *)&local_d0,
                         (string *)&local_128);
LAB_0152c074:
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_128.type_._0_8_ !=
          &local_128.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        operator_delete((void *)local_128.type_._0_8_);
      }
      goto LAB_0152fa07;
    }
    DVar5 = Date::TryConvertDate
                      ((char *)this_02,(idx_t)pcVar34,(idx_t *)&local_128,(date_t *)&local_d0,
                       (bool *)&local_90,true);
    goto LAB_0152bed9;
  case TIME:
    bVar4 = Time::TryConvertTime
                      ((char *)this_02,(idx_t)pcVar34,(idx_t *)&local_128,(dtime_t *)&local_d0,true,
                       (optional_ptr<int,_true>)0x0);
    goto LAB_0152fa07;
  default:
    LogicalType::LogicalType((LogicalType *)(local_58 + 0x10),SQLNULL);
    Value::Value(&local_128,(LogicalType *)(local_58 + 0x10));
    LogicalType::~LogicalType((LogicalType *)(local_58 + 0x10));
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    val.value.pointer.ptr = (char *)local_d8;
    val.value._0_8_ = local_e0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    Value::Value(&local_d0,val);
    bVar4 = Value::TryCastAs(&local_d0,(ClientContext *)this,this_01,&local_128,&local_90,true);
    bVar40 = local_90._M_string_length == 0;
    Value::~Value(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    bVar4 = bVar4 && bVar40;
    Value::~Value(&local_128);
    goto LAB_0152fa07;
  case TIMESTAMP:
    p_Var37 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&type[3].type_info_;
    p_Var7 = p_Var37;
    for (p_Var23 = type[3].type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi; p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (&p_Var23[1]._vptr__Sp_counted_base)[bVar4]) {
      bVar4 = *(byte *)&p_Var23[2]._vptr__Sp_counted_base < 0x13;
      if (!bVar4) {
        p_Var7 = p_Var23;
      }
    }
    p_Var23 = p_Var37;
    if ((p_Var7 != p_Var37) && (p_Var23 = p_Var7, 0x13 < *(byte *)&p_Var7[2]._vptr__Sp_counted_base)
       ) {
      p_Var23 = p_Var37;
    }
    bVar4 = StrTimeFormat::Empty((StrTimeFormat *)(p_Var23 + 3));
    if (!bVar4) {
      local_128.type_._0_8_ =
           &local_128.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_128.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffffffffff00;
      p_Var7 = p_Var37;
      for (p_Var23 = type[3].type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (&p_Var23[1]._vptr__Sp_counted_base)[bVar4]) {
        bVar4 = *(byte *)&p_Var23[2]._vptr__Sp_counted_base < 0x13;
        if (!bVar4) {
          p_Var7 = p_Var23;
        }
      }
      if ((p_Var7 != p_Var37) && (*(byte *)&p_Var7[2]._vptr__Sp_counted_base < 0x14)) {
        p_Var37 = p_Var7;
      }
      input_00.value.pointer.ptr = (char *)local_d8;
      input_00.value._0_8_ = local_e0;
      bVar4 = StrpTimeFormat::TryParseTimestamp
                        ((StrpTimeFormat *)(p_Var37 + 3),input_00,(timestamp_t *)&local_d0,
                         (string *)&local_128);
      goto LAB_0152c074;
    }
    DVar5 = Timestamp::TryConvertTimestamp
                      ((char *)this_02,(idx_t)pcVar34,(timestamp_t *)&local_d0,
                       (optional_ptr<int,_true>)0x0,true);
LAB_0152bed9:
    bVar4 = DVar5 == SUCCESS;
    goto LAB_0152fa07;
  case DECIMAL:
    LogicalType::GetDecimalProperties(this_01,(uint8_t *)&local_90,&local_129);
    if (is_null == true) {
      PVar1 = this_01->physical_type_;
      if (PVar1 < INT64) {
        if (PVar1 == INT16) {
          bVar4 = TryDecimalStringCast<short,(char)46>
                            ((char *)this_02,(idx_t)pcVar34,(short *)&local_128,
                             (uint8_t)local_90._M_dataplus._M_p,local_129);
        }
        else {
          if (PVar1 != INT32) {
LAB_01530076:
            pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
            TypeIdToString_abi_cxx11_
                      ((string *)&local_d0,(duckdb *)(ulong)this_01->physical_type_,type_00);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_128,"Invalid Physical Type for Decimal Value. Physical Type: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_d0);
            InternalException::InternalException(pIVar11,(string *)&local_128);
            __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar4 = TryDecimalStringCast<int,(char)46>
                            ((char *)this_02,(idx_t)pcVar34,(int *)&local_128,
                             (uint8_t)local_90._M_dataplus._M_p,local_129);
        }
      }
      else if (PVar1 == INT64) {
        bVar4 = TryDecimalStringCast<long,(char)46>
                          ((char *)this_02,(idx_t)pcVar34,(long *)&local_128,
                           (uint8_t)local_90._M_dataplus._M_p,local_129);
      }
      else {
        if (PVar1 != INT128) goto LAB_01530076;
        bVar4 = TryDecimalStringCast<duckdb::hugeint_t,(char)46>
                          ((char *)this_02,(idx_t)pcVar34,(hugeint_t *)&local_128,
                           (uint8_t)local_90._M_dataplus._M_p,local_129);
      }
    }
    else {
      if (is_null != true) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_128.type_._0_8_ =
             &local_128.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,
                   "Decimals can only have \',\' and \'.\' as decimal separators","");
        InvalidInputException::InvalidInputException(this_00,(string *)&local_128);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      PVar1 = this_01->physical_type_;
      if (PVar1 < INT64) {
        if (PVar1 == INT16) {
          bVar4 = TryDecimalStringCast<short,(char)44>
                            ((char *)this_02,(idx_t)pcVar34,(short *)&local_128,
                             (uint8_t)local_90._M_dataplus._M_p,local_129);
        }
        else {
          if (PVar1 != INT32) {
LAB_015300d2:
            pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
            TypeIdToString_abi_cxx11_
                      ((string *)&local_d0,(duckdb *)(ulong)this_01->physical_type_,type_01);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_128,"Invalid Physical Type for Decimal Value. Physical Type: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_d0);
            InternalException::InternalException(pIVar11,(string *)&local_128);
            __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar4 = TryDecimalStringCast<int,(char)44>
                            ((char *)this_02,(idx_t)pcVar34,(int *)&local_128,
                             (uint8_t)local_90._M_dataplus._M_p,local_129);
        }
      }
      else if (PVar1 == INT64) {
        bVar4 = TryDecimalStringCast<long,(char)44>
                          ((char *)this_02,(idx_t)pcVar34,(long *)&local_128,
                           (uint8_t)local_90._M_dataplus._M_p,local_129);
      }
      else {
        if (PVar1 != INT128) goto LAB_015300d2;
        bVar4 = TryDecimalStringCast<duckdb::hugeint_t,(char)44>
                          ((char *)this_02,(idx_t)pcVar34,(hugeint_t *)&local_128,
                           (uint8_t)local_90._M_dataplus._M_p,local_129);
      }
    }
    goto LAB_0152fa07;
  case FLOAT:
    if (pcVar34 != (char *)0x0) {
LAB_0152b865:
      bVar26 = *(byte *)&this_02->_vptr_BaseScanner;
      if ((bVar26 - 9 < 5) || (bVar26 == 0x20)) goto LAB_0152b872;
      if ((bVar26 != 0x2b) &&
         (((pcVar34 == &DAT_00000001 || (bVar26 != 0x30)) ||
          (9 < (byte)(*(char *)((long)&this_02->_vptr_BaseScanner + 1) - 0x30U))))) {
        pcVar34 = pcVar34 + (long)this_02;
        fVar41 = duckdb_fast_float::from_chars<float>
                           ((char *)this_02,pcVar34,(float *)&local_128,true,is_null,general);
        auVar2 = fVar41._0_12_;
LAB_0152ba6b:
        uVar31 = auVar2._8_4_;
        bVar4 = auVar2._0_8_ == pcVar34;
        goto LAB_0152c1e1;
      }
      break;
    }
    break;
  case DOUBLE:
    for (; pcVar34 != (char *)0x0; pcVar34 = pcVar34 + -1) {
      bVar26 = *(byte *)&this_02->_vptr_BaseScanner;
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
        if ((bVar26 != 0x2b) &&
           (((pcVar34 == &DAT_00000001 || (bVar26 != 0x30)) ||
            (9 < (byte)(*(char *)((long)&this_02->_vptr_BaseScanner + 1) - 0x30U))))) {
          pcVar34 = pcVar34 + (long)this_02;
          fVar41 = duckdb_fast_float::from_chars<double>
                             ((char *)this_02,pcVar34,(double *)&local_128,true,is_null,general);
          auVar2 = fVar41._0_12_;
          goto LAB_0152ba6b;
        }
        break;
      }
      this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
    }
    break;
  case VARCHAR:
    goto switchD_0152b763_caseD_19;
  case UTINYINT:
    if (pcVar34 != (char *)0x0) {
      bVar4 = true;
      pcVar12 = pcVar34;
      pBVar13 = this_02;
      do {
        bVar26 = *(byte *)&pBVar13->_vptr_BaseScanner;
        if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
          if (bVar26 == 0x2d) {
            pcVar36 = &DAT_00000001;
            pcVar20 = pcVar36;
            if (pcVar12 == &DAT_00000001) goto LAB_0152ca64;
            lVar35 = -2;
            goto LAB_0152b91b;
          }
          if ((pcVar12 == &DAT_00000001) || (bVar26 != 0x30)) {
            if (bVar26 == 0x2b) break;
          }
          else {
            bVar26 = *(byte *)((long)&pBVar13->_vptr_BaseScanner + 1);
            if (bVar26 < 0x62) {
              if (bVar26 == 0x42) {
LAB_0152d3ca:
                pcVar12 = pcVar12 + -1;
                bVar40 = pcVar12 >= (char *)0x2;
                if (pcVar12 < (char *)0x2) goto LAB_0152da3e;
                pcVar20 = &DAT_00000001;
                bVar26 = 0;
                goto LAB_0152d3e1;
              }
              if (bVar26 == 0x58) {
LAB_0152ccd1:
                pcVar12 = pcVar12 + -1;
                pcVar20 = &DAT_00000001;
                bVar26 = 0;
                goto LAB_0152cce5;
              }
            }
            else {
              if (bVar26 == 0x62) goto LAB_0152d3ca;
              if (bVar26 == 0x78) goto LAB_0152ccd1;
            }
            if ((byte)(bVar26 - 0x30) < 10) break;
          }
          lVar35 = -1;
          bVar26 = 0;
          pcVar20 = (char *)0x0;
          goto LAB_0152c780;
        }
        pBVar13 = (BaseScanner *)((long)&pBVar13->_vptr_BaseScanner + 1);
        pcVar12 = pcVar12 + -1;
      } while (pcVar12 != (char *)0x0);
      goto joined_r0x0152da49;
    }
    break;
  case USMALLINT:
    if (pcVar34 != (char *)0x0) {
      pcVar12 = (char *)0x0;
      bVar4 = true;
      do {
        bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
        if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
          if (bVar26 == 0x2d) {
            pcVar20 = &DAT_00000001;
            if (pcVar34 + -1 == pcVar12) goto LAB_0152d81d;
            pcVar38 = pcVar34 + -(long)pcVar12;
            bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
            pcVar36 = (char *)0x2;
            goto joined_r0x0152b7fd;
          }
          if ((pcVar34 + -1 == pcVar12) || (bVar26 != 0x30)) {
            if (bVar26 == 0x2b) break;
          }
          else {
            bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
            if (bVar26 < 0x62) {
              if (bVar26 == 0x42) {
LAB_0152d32f:
                pcVar20 = pcVar34 + ~(ulong)pcVar12;
                bVar40 = pcVar20 >= (char *)0x2;
                if (pcVar20 < (char *)0x2) goto LAB_0152d868;
                pcVar36 = &DAT_00000001;
                sVar15 = 0;
                goto LAB_0152d34c;
              }
              if (bVar26 == 0x58) {
LAB_0152cbab:
                uVar18 = 0;
                pcVar20 = &DAT_00000001;
                goto LAB_0152cbc5;
              }
            }
            else {
              if (bVar26 == 0x62) goto LAB_0152d32f;
              if (bVar26 == 0x78) goto LAB_0152cbab;
            }
            if ((byte)(bVar26 - 0x30) < 10) break;
          }
          uVar8 = (long)pcVar34 - (long)pcVar12;
          uVar19 = 0;
          lVar35 = -1;
          uVar31 = 0;
          goto LAB_0152c712;
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar34 != pcVar12);
      goto joined_r0x0152d873;
    }
    break;
  case UINTEGER:
    if (pcVar34 != (char *)0x0) {
      bVar4 = true;
      pcVar12 = pcVar34;
      pBVar13 = this_02;
      do {
        bVar26 = *(byte *)&pBVar13->_vptr_BaseScanner;
        if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
          if (bVar26 == 0x2d) {
            pcVar36 = &DAT_00000001;
            pcVar20 = pcVar36;
            if (pcVar12 == &DAT_00000001) goto LAB_0152caaf;
            lVar35 = -2;
            goto LAB_0152bc65;
          }
          if ((pcVar12 == &DAT_00000001) || (bVar26 != 0x30)) {
            if (bVar26 == 0x2b) break;
          }
          else {
            bVar26 = *(byte *)((long)&pBVar13->_vptr_BaseScanner + 1);
            if (bVar26 < 0x62) {
              if (bVar26 == 0x42) {
LAB_0152d572:
                pcVar12 = pcVar12 + -1;
                bVar40 = pcVar12 >= (char *)0x2;
                if (pcVar12 < (char *)0x2) goto LAB_0152dde9;
                pcVar20 = &DAT_00000001;
                iVar22 = 0;
                goto LAB_0152d589;
              }
              if (bVar26 == 0x58) {
LAB_0152d027:
                pcVar12 = pcVar12 + -1;
                pcVar20 = &DAT_00000001;
                uVar31 = 0;
                goto LAB_0152d03b;
              }
            }
            else {
              if (bVar26 == 0x62) goto LAB_0152d572;
              if (bVar26 == 0x78) goto LAB_0152d027;
            }
            if ((byte)(bVar26 - 0x30) < 10) break;
          }
          uVar31 = 0;
          lVar35 = -1;
          pcVar20 = (char *)0x0;
          goto LAB_0152c860;
        }
        pBVar13 = (BaseScanner *)((long)&pBVar13->_vptr_BaseScanner + 1);
        pcVar12 = pcVar12 + -1;
      } while (pcVar12 != (char *)0x0);
      goto joined_r0x0152ddf4;
    }
    break;
  case UBIGINT:
    if (pcVar34 != (char *)0x0) {
      bVar4 = true;
      pcVar12 = pcVar34;
      pBVar13 = this_02;
      do {
        bVar26 = *(byte *)&pBVar13->_vptr_BaseScanner;
        if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
          if (bVar26 == 0x2d) {
            pcVar36 = &DAT_00000001;
            pcVar20 = pcVar36;
            if (pcVar12 == &DAT_00000001) goto LAB_0152cafa;
            lVar35 = -2;
            goto LAB_0152bcda;
          }
          if ((pcVar12 == &DAT_00000001) || (bVar26 != 0x30)) {
            if (bVar26 == 0x2b) break;
          }
          else {
            bVar26 = *(byte *)((long)&pBVar13->_vptr_BaseScanner + 1);
            if (bVar26 < 0x62) {
              if (bVar26 == 0x42) {
LAB_0152d5f5:
                pcVar12 = pcVar12 + -1;
                bVar40 = pcVar12 >= (char *)0x2;
                if (pcVar12 < (char *)0x2) goto LAB_0152dfbe;
                pcVar20 = &DAT_00000001;
                lVar35 = 0;
                goto LAB_0152d60c;
              }
              if (bVar26 == 0x58) {
LAB_0152d12b:
                pcVar12 = pcVar12 + -1;
                pcVar20 = &DAT_00000001;
                uVar8 = 0;
                goto LAB_0152d13f;
              }
            }
            else {
              if (bVar26 == 0x62) goto LAB_0152d5f5;
              if (bVar26 == 0x78) goto LAB_0152d12b;
            }
            if ((byte)(bVar26 - 0x30) < 10) break;
          }
          lVar35 = -1;
          uVar8 = 0;
          pcVar20 = (char *)0x0;
          goto LAB_0152c8c9;
        }
        pBVar13 = (BaseScanner *)((long)&pBVar13->_vptr_BaseScanner + 1);
        pcVar12 = pcVar12 + -1;
      } while (pcVar12 != (char *)0x0);
      goto LAB_0152dfc6;
    }
  }
  goto switchD_0152b780_default;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    lVar35 = lVar35 + -1;
    pcVar20 = pcVar12;
    if (pcVar12 == pcVar36) break;
LAB_0152bcda:
    bVar26 = pcVar36[(long)(&pBVar13->states + -0x20)];
    if (9 < (byte)(bVar26 - 0x30)) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto LAB_0152dfc6;
      pcVar36 = (char *)-lVar35;
      pcVar20 = pcVar36;
      if (pcVar36 < pcVar12) {
        pbVar10 = (byte *)((long)pBVar13 - lVar35);
        goto LAB_0152cad1;
      }
      break;
    }
  }
  goto LAB_0152cafa;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar20 = pcVar12;
    if (pcVar12 <= pcVar36) break;
LAB_0152cad1:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto LAB_0152dfc6;
  }
LAB_0152cafa:
  bVar40 = &DAT_00000001 < pcVar20;
  goto LAB_0152dfbe;
  while( true ) {
    pcVar36 = pcVar20 + 1;
    if ((((pcVar12 != pcVar36) &&
         (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] == '_')) &&
        ((pcVar36 = pcVar20 + 2, pcVar12 == pcVar36 ||
         ((((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] & 0xfe) != 0x30)))
        ) || (pcVar20 = pcVar36, lVar35 < 0)) goto LAB_0152dfc6;
    lVar35 = lVar24 + lVar35 * 2;
    if (pcVar12 <= pcVar20) break;
LAB_0152d60c:
    cVar17 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    if (cVar17 == '0') {
      lVar24 = 0;
    }
    else {
      if (cVar17 != '1') goto LAB_0152dfc6;
      lVar24 = 1;
    }
  }
  goto LAB_0152fa07;
LAB_0152d13f:
  do {
    if (pcVar12 <= pcVar20) goto LAB_0152cafa;
    bVar26 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar36 = pcVar20 + 1;
    if ((pcVar12 == pcVar36) ||
       (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] != '_')) {
LAB_0152d1ea:
      pcVar20 = pcVar36;
      bVar40 = uVar8 <= ~(ulong)(byte)(cVar17 + bVar29) >> 4;
      if (bVar40) {
        uVar8 = uVar8 * 0x10 + (ulong)(byte)(cVar17 + bVar29);
      }
    }
    else {
      pcVar20 = pcVar20 + 2;
      if (pcVar12 != pcVar20) {
        bVar26 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
        pcVar36 = pcVar20;
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar40 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152d211;
        }
        goto LAB_0152d1ea;
      }
      bVar40 = false;
    }
LAB_0152d211:
  } while (bVar40);
  goto LAB_0152dfc6;
  while( true ) {
    if (~(ulong)bVar29 / 10 < uVar8) goto LAB_0152dfc6;
    pcVar20 = pcVar20 + 1;
    uVar8 = (ulong)bVar29 + uVar8 * 10;
    lVar35 = lVar35 + -1;
    if (pcVar12 == pcVar20) break;
LAB_0152c8c9:
    bVar26 = pcVar20[(long)(&pBVar13->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto LAB_0152dfc6;
      pcVar20 = (char *)-lVar35;
      if (pcVar12 <= pcVar20) goto LAB_0152dfb8;
      pbVar10 = (byte *)((long)pBVar13 - lVar35);
      goto LAB_0152df96;
    }
  }
  goto LAB_0152c907;
  while( true ) {
    pcVar20 = pcVar20 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar12 <= pcVar20) break;
LAB_0152df96:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto LAB_0152dfc6;
  }
LAB_0152c907:
  pcVar20 = &DAT_00000001;
LAB_0152dfb8:
  bVar40 = pcVar20 != (char *)0x0;
LAB_0152dfbe:
  if (bVar40) goto LAB_0152fa07;
LAB_0152dfc6:
  if (pcVar34 != (char *)0x0) {
    pcVar12 = (char *)0x0;
    do {
      bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pcVar20 = pcVar34 + -(long)pcVar12;
        if (bVar26 == 0x2d) {
          pcVar36 = &DAT_00000001;
          if (pcVar34 + -1 == pcVar12) goto LAB_0152fc30;
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
          pcVar34 = (char *)0x2;
          goto joined_r0x0152e039;
        }
        if ((pcVar34 + -1 == pcVar12) || (bVar26 != 0x30)) {
          if (bVar26 == 0x2b) break;
        }
        else {
          bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
          if (bVar26 < 0x62) {
            if (bVar26 == 0x42) {
LAB_0152f2d9:
              pcVar20 = pcVar34 + ~(ulong)pcVar12;
              if (pcVar20 < (char *)0x2) goto LAB_0152f371;
              pcVar36 = &DAT_00000001;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0152f2f6;
            }
            if (bVar26 == 0x58) {
LAB_0152ee00:
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              pcVar20 = &DAT_00000001;
              goto LAB_0152ee1e;
            }
          }
          else {
            if (bVar26 == 0x62) goto LAB_0152f2d9;
            if (bVar26 == 0x78) goto LAB_0152ee00;
          }
          bVar4 = false;
          if ((byte)(bVar26 - 0x30) < 10) goto LAB_0152fa07;
        }
        lVar35 = -1;
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        pcVar34 = (char *)0x0;
        goto LAB_0152e10b;
      }
      pcVar12 = pcVar12 + 1;
    } while (pcVar34 != pcVar12);
  }
  goto switchD_0152b780_default;
joined_r0x0152e039:
  if (9 < (byte)(bVar26 - 0x30)) goto LAB_0152e065;
  local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)(byte)(bVar26 - 0x30);
  pcVar36 = pcVar20;
  if (pcVar20 == pcVar34) goto LAB_0152fc30;
  bVar26 = pcVar12[(long)(pcVar34 + (long)(&this_02->states + -0x20))];
  pcVar34 = pcVar34 + 1;
  goto joined_r0x0152e039;
LAB_0152e065:
  pcVar38 = pcVar34;
  if ((bVar26 - 9 < 5) || (bVar26 == 0x20)) {
    for (; pcVar36 = pcVar34, pcVar38 < pcVar20; pcVar38 = pcVar38 + 1) {
      if ((4 < (byte)pcVar12[(long)(pcVar38 + (long)(&this_02->states + -0x20))] - 9) &&
         (pcVar12[(long)(pcVar38 + (long)(&this_02->states + -0x20))] != 0x20))
      goto switchD_0152b780_default;
      pcVar34 = pcVar20;
    }
LAB_0152fc30:
    bVar4 = IntegerDecimalCastOperation::
            Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                      ((IntegerDecimalCastData<unsigned_long> *)&local_128);
    goto LAB_0152f80d;
  }
  goto switchD_0152b780_default;
  while( true ) {
    pcVar30 = pcVar36 + 1;
    if ((pcVar34 + (-2 - (long)pcVar36) != pcVar12) && ((pcVar12 + 2)[(long)pcVar38] == '_')) {
      if ((pcVar34 + (-3 - (long)pcVar36) == pcVar12) ||
         (((pcVar12 + 3)[(long)pcVar38] & 0xfeU) != 0x30)) goto LAB_0152fa00;
      pcVar30 = pcVar36 + 2;
    }
    pcVar36 = pcVar30;
    if ((long)local_128.type_._0_8_ < 0) goto LAB_0152fa00;
    local_128.type_._0_8_ = lVar35 + local_128.type_._0_8_ * 2;
    if (pcVar20 <= pcVar36) break;
LAB_0152f2f6:
    pcVar38 = pcVar36 + (long)this_02;
    if ((pcVar12 + 1)[(long)pcVar38] == '0') {
      lVar35 = 0;
    }
    else {
      if ((pcVar12 + 1)[(long)pcVar38] != '1') goto LAB_0152fa00;
      lVar35 = 1;
    }
  }
LAB_0152f371:
  bVar40 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                     ((IntegerDecimalCastData<unsigned_long> *)&local_128);
  goto LAB_0152fce3;
LAB_0152ee1e:
  do {
    if (pcVar34 + ~(ulong)pcVar12 <= pcVar20) {
      bVar40 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                         ((IntegerDecimalCastData<unsigned_long> *)&local_128);
      goto LAB_0152fce3;
    }
    pcVar36 = pcVar20 + (long)this_02;
    bVar26 = (pcVar12 + 1)[(long)pcVar36];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar38 = pcVar20 + 1;
    if ((pcVar34 + (-2 - (long)pcVar20) == pcVar12) || ((pcVar12 + 2)[(long)pcVar36] != '_')) {
LAB_0152eedb:
      bVar4 = (ulong)local_128.type_._0_8_ <=
              (__shared_count<(__gnu_cxx::_Lock_policy)2> **)(~(ulong)(byte)(cVar17 + bVar29) >> 4);
      if (bVar4) {
        local_128.type_._0_8_ = local_128.type_._0_8_ * 0x10 + (ulong)(byte)(cVar17 + bVar29);
      }
    }
    else {
      pcVar38 = pcVar20 + 2;
      if (pcVar34 + (-3 - (long)pcVar20) != pcVar12) {
        if (9 < (byte)((pcVar12 + 3)[(long)pcVar36] - 0x30U)) {
          uVar31 = (byte)(pcVar12 + 3)[(long)pcVar36] - 0x41;
          bVar4 = false;
          if ((0x25 < uVar31) || (bVar4 = false, (0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0)
             ) goto LAB_0152ef02;
        }
        goto LAB_0152eedb;
      }
      bVar4 = false;
    }
LAB_0152ef02:
    pcVar20 = pcVar38;
  } while (bVar4);
  goto LAB_0152fa00;
  while( true ) {
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)(~(ulong)bVar29 / 10) <
        (ulong)local_128.type_._0_8_) goto switchD_0152b780_default;
    pcVar34 = pcVar34 + 1;
    local_128.type_._0_8_ = (ulong)bVar29 + local_128.type_._0_8_ * 10;
    lVar35 = lVar35 + -1;
    if (pcVar20 == pcVar34) break;
LAB_0152e10b:
    bVar26 = pcVar12[(long)(pcVar34 + (long)(&this_02->states + -0x20))];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar36 = (char *)-lVar35;
      if (pcVar20 <= pcVar36) goto LAB_0152f5de;
      pbVar10 = (byte *)(pcVar34 + (long)(pcVar12 + (long)(&this_02->states + -0x20)));
      goto LAB_0152f5b9;
    }
  }
  goto LAB_0152e151;
  while (pcVar36 = pcVar36 + 1, pcVar36 < pcVar20) {
LAB_0152f5b9:
    pbVar10 = pbVar10 + 1;
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152e151:
  pcVar36 = &DAT_00000001;
LAB_0152f5de:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                    ((IntegerDecimalCastData<unsigned_long> *)&local_128);
  goto LAB_0152f58e;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    lVar35 = lVar35 + -1;
    pcVar20 = pcVar12;
    if (pcVar12 == pcVar36) break;
LAB_0152bc65:
    bVar26 = pcVar36[(long)(&pBVar13->states + -0x20)];
    if (9 < (byte)(bVar26 - 0x30)) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152ddf4;
      pcVar36 = (char *)-lVar35;
      pcVar20 = pcVar36;
      if (pcVar36 < pcVar12) {
        pbVar10 = (byte *)((long)pBVar13 - lVar35);
        goto LAB_0152ca86;
      }
      break;
    }
  }
  goto LAB_0152caaf;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar20 = pcVar12;
    if (pcVar12 <= pcVar36) break;
LAB_0152ca86:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152ddf4;
  }
LAB_0152caaf:
  bVar40 = &DAT_00000001 < pcVar20;
  goto LAB_0152dde9;
  while( true ) {
    pcVar36 = pcVar20 + 1;
    if ((((pcVar12 != pcVar36) &&
         (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] == '_')) &&
        ((pcVar36 = pcVar20 + 2, pcVar12 == pcVar36 ||
         ((((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] & 0xfe) != 0x30)))
        ) || (pcVar20 = pcVar36, iVar22 < 0)) goto joined_r0x0152ddf4;
    iVar22 = iVar16 + iVar22 * 2;
    if (pcVar12 <= pcVar20) break;
LAB_0152d589:
    cVar17 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    iVar16 = 0;
    if (cVar17 != '0') {
      if (cVar17 != '1') goto joined_r0x0152ddf4;
      iVar16 = 1;
    }
  }
  goto LAB_0152fa07;
LAB_0152d03b:
  do {
    if (pcVar12 <= pcVar20) goto LAB_0152caaf;
    bVar26 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar36 = pcVar20 + 1;
    if ((pcVar12 == pcVar36) ||
       (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] != '_')) {
LAB_0152d0e6:
      pcVar20 = pcVar36;
      bVar40 = uVar31 <= ~(uint)(byte)(cVar17 + bVar29) >> 4;
      if (bVar40) {
        uVar31 = uVar31 * 0x10 + (uint)(byte)(cVar17 + bVar29);
      }
    }
    else {
      pcVar20 = pcVar20 + 2;
      if (pcVar12 != pcVar20) {
        bVar26 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
        pcVar36 = pcVar20;
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar40 = false;
          uVar32 = bVar26 - 0x41;
          if ((0x25 < uVar32) || ((0x3f0000003fU >> ((ulong)uVar32 & 0x3f) & 1) == 0))
          goto LAB_0152d10b;
        }
        goto LAB_0152d0e6;
      }
      bVar40 = false;
    }
LAB_0152d10b:
  } while (bVar40);
  goto joined_r0x0152ddf4;
  while( true ) {
    if (~(uint)bVar29 / 10 < uVar31) goto joined_r0x0152ddf4;
    pcVar20 = pcVar20 + 1;
    uVar31 = (uint)bVar29 + uVar31 * 10;
    lVar35 = lVar35 + -1;
    if (pcVar12 == pcVar20) break;
LAB_0152c860:
    bVar26 = pcVar20[(long)(&pBVar13->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152ddf4;
      pcVar20 = (char *)-lVar35;
      if (pcVar12 <= pcVar20) goto LAB_0152dde3;
      pbVar10 = (byte *)((long)pBVar13 - lVar35);
      goto LAB_0152ddc1;
    }
  }
  goto LAB_0152c8a0;
  while( true ) {
    pcVar20 = pcVar20 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar12 <= pcVar20) break;
LAB_0152ddc1:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152ddf4;
  }
LAB_0152c8a0:
  pcVar20 = &DAT_00000001;
LAB_0152dde3:
  bVar40 = pcVar20 != (char *)0x0;
LAB_0152dde9:
  if (!bVar40) {
joined_r0x0152ddf4:
    do {
      if (pcVar34 == (char *)0x0) goto switchD_0152b780_default;
      bVar26 = *(byte *)&this_02->_vptr_BaseScanner;
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (bVar26 == 0x2d) {
          pcVar36 = &DAT_00000001;
          if (pcVar34 == &DAT_00000001) goto LAB_0152e899;
          pcVar12 = &DAT_00000001;
          lVar35 = -2;
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_0152de68;
        }
        if ((pcVar34 == &DAT_00000001) || (bVar26 != 0x30)) {
          if (bVar26 == 0x2b) goto switchD_0152b780_default;
        }
        else {
          bVar26 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
          if (bVar26 < 0x62) {
            if (bVar26 == 0x42) {
LAB_0152f240:
              pcVar20 = pcVar34 + -1;
              if (pcVar20 < (char *)0x2) goto LAB_0152f2c6;
              pcVar34 = &DAT_00000001;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0152f25d;
            }
            if (bVar26 == 0x58) {
LAB_0152ecf5:
              pcVar34 = pcVar34 + -1;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              pcVar20 = &DAT_00000001;
              goto LAB_0152ed17;
            }
          }
          else {
            if (bVar26 == 0x62) goto LAB_0152f240;
            if (bVar26 == 0x78) goto LAB_0152ecf5;
          }
          if ((byte)(bVar26 - 0x30) < 10) goto switchD_0152b780_default;
        }
        lVar35 = -1;
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        pcVar12 = (char *)0x0;
        goto LAB_0152df2e;
      }
      this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
      pcVar34 = pcVar34 + -1;
    } while( true );
  }
  goto LAB_0152fa07;
  while( true ) {
    if ((long)local_128.type_._0_8_ < (long)((ulong)bVar29 + 0x8000000000000000) / 10)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)bVar29;
    lVar35 = lVar35 + -1;
    pcVar36 = pcVar34;
    if (pcVar34 == pcVar12) break;
LAB_0152de68:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar12 = (char *)-lVar35;
      pcVar36 = pcVar12;
      if (pcVar12 < pcVar34) {
        pbVar10 = (byte *)((long)this_02 - lVar35);
        goto LAB_0152e874;
      }
      break;
    }
  }
  goto LAB_0152e899;
  while( true ) {
    pcVar12 = pcVar12 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar36 = pcVar34;
    if (pcVar34 <= pcVar12) break;
LAB_0152e874:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152e899:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                    ((IntegerDecimalCastData<unsigned_int> *)&local_128);
  goto LAB_0152f80d;
  while( true ) {
    pcVar12 = pcVar34 + 1;
    if ((((pcVar20 != pcVar12) &&
         (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] == '_')) &&
        ((pcVar12 = pcVar34 + 2, pcVar20 == pcVar12 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] & 0xfe) != 0x30)))
        ) || (pcVar34 = pcVar12, 0x3fffffffffffffff < (long)local_128.type_._0_8_))
    goto LAB_0152fa00;
    local_128.type_._0_8_ = lVar35 + local_128.type_._0_8_ * 2;
    if (pcVar20 <= pcVar34) break;
LAB_0152f25d:
    cVar17 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar34];
    if (cVar17 == '0') {
      lVar35 = 0;
    }
    else {
      if (cVar17 != '1') goto LAB_0152fa00;
      lVar35 = 1;
    }
  }
LAB_0152f2c6:
  bVar40 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                     ((IntegerDecimalCastData<unsigned_int> *)&local_128);
  goto LAB_0152fce3;
LAB_0152ed17:
  do {
    if (pcVar34 <= pcVar20) {
      bVar40 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                         ((IntegerDecimalCastData<unsigned_int> *)&local_128);
      goto LAB_0152fce3;
    }
    bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar12 = pcVar20 + 1;
    if ((pcVar34 == pcVar12) ||
       (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] != '_')) {
LAB_0152edbb:
      uVar8 = (ulong)((byte)(cVar17 + bVar29) >> 4) ^ 0x7ffffffffffffff;
      pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_128.type_._0_8_;
      if ((long)local_128.type_._0_8_ <= (long)uVar8) {
        pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  (local_128.type_._0_8_ * 0x10 + (ulong)(byte)(cVar17 + bVar29));
      }
      bVar4 = (long)local_128.type_._0_8_ <= (long)uVar8;
      local_128.type_._0_8_ = pp_Var9;
    }
    else {
      pcVar12 = pcVar20 + 2;
      if (pcVar34 != pcVar12) {
        bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar4 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152ede0;
        }
        goto LAB_0152edbb;
      }
      bVar4 = false;
    }
LAB_0152ede0:
    pcVar20 = pcVar12;
  } while (bVar4);
  goto LAB_0152fa00;
  while( true ) {
    if ((long)(((ulong)bVar29 ^ 0x7ffffffffffffffe) / 10) < (long)local_128.type_._0_8_)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = (ulong)bVar29 + local_128.type_._0_8_ * 10;
    lVar35 = lVar35 + -1;
    if (pcVar34 == pcVar12) break;
LAB_0152df2e:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar36 = (char *)-lVar35;
      if (pcVar34 <= pcVar36) goto LAB_0152f57f;
      pbVar10 = (byte *)((long)this_02 - lVar35);
      goto LAB_0152f55a;
    }
  }
  goto LAB_0152df71;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar34 <= pcVar36) break;
LAB_0152f55a:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152df71:
  pcVar36 = &DAT_00000001;
LAB_0152f57f:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                    ((IntegerDecimalCastData<unsigned_int> *)&local_128);
  goto LAB_0152f58e;
joined_r0x0152b7fd:
  if (9 < (byte)(bVar26 - 0x30)) goto LAB_0152b81c;
  pcVar20 = pcVar38;
  if (pcVar38 == pcVar36) goto LAB_0152d81d;
  bVar26 = pcVar12[(long)(pcVar36 + (long)(&this_02->states + -0x20))];
  pcVar36 = pcVar36 + 1;
  goto joined_r0x0152b7fd;
LAB_0152b81c:
  pcVar20 = pcVar36;
  if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152d873;
  for (; pcVar36 < pcVar38; pcVar36 = pcVar36 + 1) {
    if ((4 < (byte)pcVar12[(long)(pcVar36 + (long)(&this_02->states + -0x20))] - 9) &&
       (pcVar12[(long)(pcVar36 + (long)(&this_02->states + -0x20))] != 0x20))
    goto joined_r0x0152d873;
    pcVar20 = pcVar38;
  }
LAB_0152d81d:
  bVar40 = &DAT_00000001 < pcVar20;
  goto LAB_0152d868;
  while( true ) {
    pcVar30 = pcVar36 + 1;
    if ((pcVar34 + (-2 - (long)pcVar36) != pcVar12) && ((pcVar12 + 2)[(long)pcVar38] == '_')) {
      if ((pcVar34 + (-3 - (long)pcVar36) == pcVar12) ||
         (((pcVar12 + 3)[(long)pcVar38] & 0xfeU) != 0x30)) goto joined_r0x0152d873;
      pcVar30 = pcVar36 + 2;
    }
    pcVar36 = pcVar30;
    if (sVar15 < 0) goto joined_r0x0152d873;
    sVar15 = sVar21 + sVar15 * 2;
    if (pcVar20 <= pcVar36) break;
LAB_0152d34c:
    pcVar38 = pcVar36 + (long)this_02;
    if ((pcVar12 + 1)[(long)pcVar38] == '0') {
      sVar21 = 0;
    }
    else {
      if ((pcVar12 + 1)[(long)pcVar38] != '1') goto joined_r0x0152d873;
      sVar21 = 1;
    }
  }
  goto LAB_0152fa07;
LAB_0152cbc5:
  do {
    if (pcVar34 + ~(ulong)pcVar12 <= pcVar20) goto LAB_0152d81d;
    pcVar36 = pcVar20 + (long)this_02;
    bVar26 = (pcVar12 + 1)[(long)pcVar36];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar38 = pcVar20 + 1;
    if ((pcVar34 + (-2 - (long)pcVar20) == pcVar12) || ((pcVar12 + 2)[(long)pcVar36] != '_')) {
LAB_0152cc82:
      bVar40 = uVar18 <= (ushort)((byte)(cVar17 + bVar29) >> 4 ^ 0xfff);
      if (bVar40) {
        uVar18 = uVar18 * 0x10 + (ushort)(byte)(cVar17 + bVar29);
      }
    }
    else {
      pcVar38 = pcVar20 + 2;
      if (pcVar34 + (-3 - (long)pcVar20) != pcVar12) {
        if (9 < (byte)((pcVar12 + 3)[(long)pcVar36] - 0x30U)) {
          bVar40 = false;
          uVar31 = (byte)(pcVar12 + 3)[(long)pcVar36] - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152ccb1;
        }
        goto LAB_0152cc82;
      }
      bVar40 = false;
    }
LAB_0152ccb1:
    pcVar20 = pcVar38;
  } while (bVar40);
  goto joined_r0x0152d873;
  while( true ) {
    if ((bVar29 ^ 0xfffe) / 10 < (uVar31 & 0xffff)) goto joined_r0x0152d873;
    uVar19 = uVar19 + 1;
    uVar31 = (uint)bVar29 + (uVar31 & 0xffff) * 10;
    lVar35 = lVar35 + -1;
    if (uVar8 == uVar19) break;
LAB_0152c712:
    bVar26 = pcVar12[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar19]
    ;
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152d873;
      uVar14 = -lVar35;
      if (uVar8 <= uVar14) goto LAB_0152d862;
      pbVar10 = (byte *)(pcVar12 + (long)this_02 + uVar19);
      goto LAB_0152d840;
    }
  }
  goto LAB_0152c762;
  while (uVar14 = uVar14 + 1, uVar14 < uVar8) {
LAB_0152d840:
    pbVar10 = pbVar10 + 1;
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152d873;
  }
LAB_0152c762:
  uVar14 = 1;
LAB_0152d862:
  bVar40 = uVar14 != 0;
LAB_0152d868:
  if (!bVar40) {
joined_r0x0152d873:
    do {
      if (pcVar34 == (char *)0x0) goto switchD_0152b780_default;
      bVar26 = *(byte *)&this_02->_vptr_BaseScanner;
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (bVar26 == 0x2d) {
          pcVar36 = &DAT_00000001;
          if (pcVar34 == &DAT_00000001) goto LAB_0152e74d;
          pcVar12 = &DAT_00000001;
          lVar35 = -2;
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_0152d8e7;
        }
        if ((pcVar34 == &DAT_00000001) || (bVar26 != 0x30)) {
          if (bVar26 == 0x2b) goto switchD_0152b780_default;
        }
        else {
          bVar26 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
          if (bVar26 < 0x62) {
            if (bVar26 == 0x42) {
LAB_0152efec:
              pcVar20 = pcVar34 + -1;
              if (pcVar20 < (char *)0x2) goto LAB_0152f072;
              pcVar34 = &DAT_00000001;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0152f009;
            }
            if (bVar26 == 0x58) {
LAB_0152e8c9:
              pcVar34 = pcVar34 + -1;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              pcVar20 = &DAT_00000001;
              goto LAB_0152e8eb;
            }
          }
          else {
            if (bVar26 == 0x62) goto LAB_0152efec;
            if (bVar26 == 0x78) goto LAB_0152e8c9;
          }
          if ((byte)(bVar26 - 0x30) < 10) goto switchD_0152b780_default;
        }
        lVar35 = -1;
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        pcVar12 = (char *)0x0;
        goto LAB_0152d9ad;
      }
      this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
      pcVar34 = pcVar34 + -1;
    } while( true );
  }
  goto LAB_0152fa07;
  while( true ) {
    if ((long)local_128.type_._0_8_ < (long)((ulong)bVar29 + 0x8000000000000000) / 10)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)bVar29;
    lVar35 = lVar35 + -1;
    pcVar36 = pcVar34;
    if (pcVar34 == pcVar12) break;
LAB_0152d8e7:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar12 = (char *)-lVar35;
      pcVar36 = pcVar12;
      if (pcVar12 < pcVar34) {
        pbVar10 = (byte *)((long)this_02 - lVar35);
        goto LAB_0152e728;
      }
      break;
    }
  }
  goto LAB_0152e74d;
  while( true ) {
    pcVar12 = pcVar12 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar36 = pcVar34;
    if (pcVar34 <= pcVar12) break;
LAB_0152e728:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152e74d:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                    ((IntegerDecimalCastData<unsigned_short> *)&local_128);
  goto LAB_0152f80d;
  while( true ) {
    pcVar12 = pcVar34 + 1;
    if ((((pcVar20 != pcVar12) &&
         (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] == '_')) &&
        ((pcVar12 = pcVar34 + 2, pcVar20 == pcVar12 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] & 0xfe) != 0x30)))
        ) || (pcVar34 = pcVar12, 0x3fffffffffffffff < (long)local_128.type_._0_8_))
    goto LAB_0152fa00;
    local_128.type_._0_8_ = lVar35 + local_128.type_._0_8_ * 2;
    if (pcVar20 <= pcVar34) break;
LAB_0152f009:
    cVar17 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar34];
    if (cVar17 == '0') {
      lVar35 = 0;
    }
    else {
      if (cVar17 != '1') goto LAB_0152fa00;
      lVar35 = 1;
    }
  }
LAB_0152f072:
  bVar40 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                     ((IntegerDecimalCastData<unsigned_short> *)&local_128);
  goto LAB_0152fce3;
LAB_0152e8eb:
  do {
    if (pcVar34 <= pcVar20) {
      bVar40 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                         ((IntegerDecimalCastData<unsigned_short> *)&local_128);
      goto LAB_0152fce3;
    }
    bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar12 = pcVar20 + 1;
    if ((pcVar34 == pcVar12) ||
       (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] != '_')) {
LAB_0152e98f:
      uVar8 = (ulong)((byte)(cVar17 + bVar29) >> 4) ^ 0x7ffffffffffffff;
      pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_128.type_._0_8_;
      if ((long)local_128.type_._0_8_ <= (long)uVar8) {
        pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  (local_128.type_._0_8_ * 0x10 + (ulong)(byte)(cVar17 + bVar29));
      }
      bVar4 = (long)local_128.type_._0_8_ <= (long)uVar8;
      local_128.type_._0_8_ = pp_Var9;
    }
    else {
      pcVar12 = pcVar20 + 2;
      if (pcVar34 != pcVar12) {
        bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar4 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152e9b4;
        }
        goto LAB_0152e98f;
      }
      bVar4 = false;
    }
LAB_0152e9b4:
    pcVar20 = pcVar12;
  } while (bVar4);
  goto LAB_0152fa00;
  while( true ) {
    if ((long)(((ulong)bVar29 ^ 0x7ffffffffffffffe) / 10) < (long)local_128.type_._0_8_)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = (ulong)bVar29 + local_128.type_._0_8_ * 10;
    lVar35 = lVar35 + -1;
    if (pcVar34 == pcVar12) break;
LAB_0152d9ad:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar36 = (char *)-lVar35;
      if (pcVar34 <= pcVar36) goto LAB_0152f436;
      pbVar10 = (byte *)((long)this_02 - lVar35);
      goto LAB_0152f411;
    }
  }
  goto LAB_0152d9f0;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar34 <= pcVar36) break;
LAB_0152f411:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152d9f0:
  pcVar36 = &DAT_00000001;
LAB_0152f436:
  bVar4 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                    ((IntegerDecimalCastData<unsigned_short> *)&local_128);
  goto LAB_0152f58e;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    lVar35 = lVar35 + -1;
    pcVar20 = pcVar12;
    if (pcVar12 == pcVar36) break;
LAB_0152b91b:
    bVar26 = pcVar36[(long)(&pBVar13->states + -0x20)];
    if (9 < (byte)(bVar26 - 0x30)) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152da49;
      pcVar36 = (char *)-lVar35;
      pcVar20 = pcVar36;
      if (pcVar36 < pcVar12) {
        pbVar10 = (byte *)((long)pBVar13 - lVar35);
        goto LAB_0152ca3b;
      }
      break;
    }
  }
  goto LAB_0152ca64;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar20 = pcVar12;
    if (pcVar12 <= pcVar36) break;
LAB_0152ca3b:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152da49;
  }
LAB_0152ca64:
  bVar40 = &DAT_00000001 < pcVar20;
  goto LAB_0152da3e;
  while( true ) {
    pcVar36 = pcVar20 + 1;
    if ((((pcVar12 != pcVar36) &&
         (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] == '_')) &&
        ((pcVar36 = pcVar20 + 2, pcVar12 == pcVar36 ||
         ((((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] & 0xfe) != 0x30)))
        ) || (pcVar20 = pcVar36, (char)bVar26 < '\0')) goto joined_r0x0152da49;
    bVar26 = bVar26 * '\x02' | bVar29;
    if (pcVar12 <= pcVar20) break;
LAB_0152d3e1:
    cVar17 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    if (cVar17 == '0') {
      bVar29 = 0;
    }
    else {
      if (cVar17 != '1') goto joined_r0x0152da49;
      bVar29 = 1;
    }
  }
  goto LAB_0152fa07;
LAB_0152cce5:
  do {
    if (pcVar12 <= pcVar20) goto LAB_0152ca64;
    bVar29 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar3 = bVar29 | 0x20;
    if (0x19 < (byte)(bVar29 + 0xbf)) {
      bVar3 = bVar29;
    }
    if ((9 < (byte)(bVar3 - 0x30)) &&
       ((0x25 < bVar3 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar3 < 'a') {
      cVar17 = -0x30;
    }
    pcVar36 = pcVar20 + 1;
    if ((pcVar12 == pcVar36) ||
       (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] != '_')) {
LAB_0152cd90:
      pcVar20 = pcVar36;
      bVar40 = bVar26 <= (byte)~(cVar17 + bVar3) >> 4;
      if (bVar40) {
        bVar26 = cVar17 + bVar3 + bVar26 * '\x10';
      }
    }
    else {
      pcVar20 = pcVar20 + 2;
      if (pcVar12 != pcVar20) {
        bVar29 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
        pcVar36 = pcVar20;
        if (9 < (byte)(bVar29 - 0x30)) {
          bVar40 = false;
          uVar31 = bVar29 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152cdb5;
        }
        goto LAB_0152cd90;
      }
      bVar40 = false;
    }
LAB_0152cdb5:
  } while (bVar40);
  goto joined_r0x0152da49;
  while( true ) {
    if ((byte)(0x2f - bVar29) / 10 < bVar26) goto joined_r0x0152da49;
    pcVar20 = pcVar20 + 1;
    bVar26 = (bVar29 - 0x30) + bVar26 * '\n';
    lVar35 = lVar35 + -1;
    if (pcVar12 == pcVar20) break;
LAB_0152c780:
    bVar29 = pcVar20[(long)(&pBVar13->states + -0x20)];
    if (9 < (byte)(bVar29 - 0x30)) {
      if ((4 < bVar29 - 9) && (bVar29 != 0x20)) goto joined_r0x0152da49;
      pcVar20 = (char *)-lVar35;
      if (pcVar12 <= pcVar20) goto LAB_0152da38;
      pbVar10 = (byte *)((long)pBVar13 - lVar35);
      goto LAB_0152da16;
    }
  }
  goto LAB_0152c7cb;
  while( true ) {
    pcVar20 = pcVar20 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar12 <= pcVar20) break;
LAB_0152da16:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152da49;
  }
LAB_0152c7cb:
  pcVar20 = &DAT_00000001;
LAB_0152da38:
  bVar40 = pcVar20 != (char *)0x0;
LAB_0152da3e:
  if (!bVar40) {
joined_r0x0152da49:
    do {
      if (pcVar34 == (char *)0x0) goto switchD_0152b780_default;
      bVar26 = *(byte *)&this_02->_vptr_BaseScanner;
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (bVar26 == 0x2d) {
          pcVar36 = &DAT_00000001;
          if (pcVar34 == &DAT_00000001) goto LAB_0152e846;
          pcVar12 = &DAT_00000001;
          lVar35 = -2;
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_0152dabd;
        }
        if ((pcVar34 == &DAT_00000001) || (bVar26 != 0x30)) {
          if (bVar26 == 0x2b) goto switchD_0152b780_default;
        }
        else {
          bVar26 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
          if (bVar26 < 0x62) {
            if (bVar26 == 0x42) {
LAB_0152f1ab:
              pcVar20 = pcVar34 + -1;
              if (pcVar20 < (char *)0x2) goto LAB_0152f231;
              pcVar34 = &DAT_00000001;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0152f1c8;
            }
            if (bVar26 == 0x58) {
LAB_0152ebea:
              pcVar34 = pcVar34 + -1;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              pcVar20 = &DAT_00000001;
              goto LAB_0152ec0c;
            }
          }
          else {
            if (bVar26 == 0x62) goto LAB_0152f1ab;
            if (bVar26 == 0x78) goto LAB_0152ebea;
          }
          if ((byte)(bVar26 - 0x30) < 10) goto switchD_0152b780_default;
        }
        lVar35 = -1;
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        pcVar12 = (char *)0x0;
        goto LAB_0152db83;
      }
      this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
      pcVar34 = pcVar34 + -1;
    } while( true );
  }
  goto LAB_0152fa07;
  while( true ) {
    if ((long)local_128.type_._0_8_ < (long)((ulong)bVar29 + 0x8000000000000000) / 10)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)bVar29;
    lVar35 = lVar35 + -1;
    pcVar36 = pcVar34;
    if (pcVar34 == pcVar12) break;
LAB_0152dabd:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar12 = (char *)-lVar35;
      pcVar36 = pcVar12;
      if (pcVar12 < pcVar34) {
        pbVar10 = (byte *)((long)this_02 - lVar35);
        goto LAB_0152e821;
      }
      break;
    }
  }
  goto LAB_0152e846;
  while( true ) {
    pcVar12 = pcVar12 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar36 = pcVar34;
    if (pcVar34 <= pcVar12) break;
LAB_0152e821:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152e846:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                    ((IntegerDecimalCastData<unsigned_char> *)&local_128);
  goto LAB_0152f80d;
  while( true ) {
    pcVar12 = pcVar34 + 1;
    if ((((pcVar20 != pcVar12) &&
         (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] == '_')) &&
        ((pcVar12 = pcVar34 + 2, pcVar20 == pcVar12 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] & 0xfe) != 0x30)))
        ) || (pcVar34 = pcVar12, 0x3fffffffffffffff < (long)local_128.type_._0_8_))
    goto LAB_0152fa00;
    local_128.type_._0_8_ = lVar35 + local_128.type_._0_8_ * 2;
    if (pcVar20 <= pcVar34) break;
LAB_0152f1c8:
    cVar17 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar34];
    if (cVar17 == '0') {
      lVar35 = 0;
    }
    else {
      if (cVar17 != '1') goto LAB_0152fa00;
      lVar35 = 1;
    }
  }
LAB_0152f231:
  bVar40 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                     ((IntegerDecimalCastData<unsigned_char> *)&local_128);
  goto LAB_0152fce3;
LAB_0152ec0c:
  do {
    if (pcVar34 <= pcVar20) {
      bVar40 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                         ((IntegerDecimalCastData<unsigned_char> *)&local_128);
      goto LAB_0152fce3;
    }
    bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar12 = pcVar20 + 1;
    if ((pcVar34 == pcVar12) ||
       (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] != '_')) {
LAB_0152ecb0:
      uVar8 = (ulong)((byte)(cVar17 + bVar29) >> 4) ^ 0x7ffffffffffffff;
      pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_128.type_._0_8_;
      if ((long)local_128.type_._0_8_ <= (long)uVar8) {
        pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  (local_128.type_._0_8_ * 0x10 + (ulong)(byte)(cVar17 + bVar29));
      }
      bVar4 = (long)local_128.type_._0_8_ <= (long)uVar8;
      local_128.type_._0_8_ = pp_Var9;
    }
    else {
      pcVar12 = pcVar20 + 2;
      if (pcVar34 != pcVar12) {
        bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar4 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152ecd5;
        }
        goto LAB_0152ecb0;
      }
      bVar4 = false;
    }
LAB_0152ecd5:
    pcVar20 = pcVar12;
  } while (bVar4);
  goto LAB_0152fa00;
  while( true ) {
    if ((long)(((ulong)bVar29 ^ 0x7ffffffffffffffe) / 10) < (long)local_128.type_._0_8_)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = (ulong)bVar29 + local_128.type_._0_8_ * 10;
    lVar35 = lVar35 + -1;
    if (pcVar34 == pcVar12) break;
LAB_0152db83:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar36 = (char *)-lVar35;
      if (pcVar34 <= pcVar36) goto LAB_0152f52f;
      pbVar10 = (byte *)((long)this_02 - lVar35);
      goto LAB_0152f50a;
    }
  }
  goto LAB_0152dbc6;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar34 <= pcVar36) break;
LAB_0152f50a:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152dbc6:
  pcVar36 = &DAT_00000001;
LAB_0152f52f:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    ((IntegerDecimalCastData<unsigned_char> *)&local_128);
  goto LAB_0152f58e;
LAB_0152b872:
  this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
  pcVar34 = pcVar34 + -1;
  if (pcVar34 == (char *)0x0) goto switchD_0152b780_default;
  goto LAB_0152b865;
  while( true ) {
    if (lVar24 < (long)((ulong)bVar29 + 0x8000000000000000) / 10) goto joined_r0x0152dc1e;
    pcVar36 = pcVar36 + 1;
    lVar24 = lVar24 * 10 - (ulong)bVar29;
    lVar35 = lVar35 + -1;
    pcVar20 = pcVar12;
    if (pcVar12 == pcVar36) break;
LAB_0152b9ad:
    bVar26 = pcVar36[(long)(&pBVar13->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152dc1e;
      pcVar36 = (char *)-lVar35;
      pcVar20 = pcVar36;
      if (pcVar36 < pcVar12) {
        pbVar10 = (byte *)((long)pBVar13 - lVar35);
        goto LAB_0152cb1c;
      }
      break;
    }
  }
  goto LAB_0152cb45;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar20 = pcVar12;
    if (pcVar12 <= pcVar36) break;
LAB_0152cb1c:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152dc1e;
  }
LAB_0152cb45:
  bVar40 = &DAT_00000001 < pcVar20;
  goto LAB_0152dc13;
  while( true ) {
    pcVar36 = pcVar20 + 1;
    if ((((pcVar12 != pcVar36) &&
         (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] == '_')) &&
        ((pcVar36 = pcVar20 + 2, pcVar12 == pcVar36 ||
         ((((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] & 0xfe) != 0x30)))
        ) || (pcVar20 = pcVar36, 0x3fffffffffffffff < lVar35)) goto joined_r0x0152dc1e;
    lVar35 = lVar24 + lVar35 * 2;
    if (pcVar12 <= pcVar20) break;
LAB_0152d46a:
    cVar17 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    if (cVar17 == '0') {
      lVar24 = 0;
    }
    else {
      if (cVar17 != '1') goto joined_r0x0152dc1e;
      lVar24 = 1;
    }
  }
  goto LAB_0152fa07;
LAB_0152cdf4:
  do {
    if (pcVar12 <= pcVar20) goto LAB_0152cb45;
    bVar26 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar36 = pcVar20 + 1;
    if ((pcVar12 == pcVar36) ||
       (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] != '_')) {
LAB_0152cea5:
      pcVar20 = pcVar36;
      uVar8 = (ulong)((byte)(cVar17 + bVar29) >> 4) ^ 0x7ffffffffffffff;
      lVar24 = lVar35;
      if (lVar35 <= (long)uVar8) {
        lVar24 = lVar35 * 0x10 + (ulong)(byte)(cVar17 + bVar29);
      }
      bVar4 = lVar35 <= (long)uVar8;
      lVar35 = lVar24;
    }
    else {
      pcVar20 = pcVar20 + 2;
      if (pcVar12 != pcVar20) {
        bVar26 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
        pcVar36 = pcVar20;
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar4 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152cecc;
        }
        goto LAB_0152cea5;
      }
      bVar4 = false;
    }
LAB_0152cecc:
  } while (bVar4);
  goto joined_r0x0152dc1e;
  while( true ) {
    if ((long)(((ulong)bVar29 ^ 0x7ffffffffffffffe) / 10) < lVar35) goto joined_r0x0152dc1e;
    pcVar20 = pcVar20 + 1;
    lVar35 = (ulong)bVar29 + lVar35 * 10;
    lVar24 = lVar24 + -1;
    if (pcVar12 == pcVar20) break;
LAB_0152c7fe:
    bVar26 = pcVar20[(long)(&pBVar13->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152dc1e;
      pcVar20 = (char *)-lVar24;
      if (pcVar12 <= pcVar20) goto LAB_0152dc0d;
      pbVar10 = (byte *)((long)pBVar13 - lVar24);
      goto LAB_0152dbeb;
    }
  }
  goto LAB_0152c83c;
  while( true ) {
    pcVar20 = pcVar20 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar12 <= pcVar20) break;
LAB_0152dbeb:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152dc1e;
  }
LAB_0152c83c:
  pcVar20 = &DAT_00000001;
LAB_0152dc0d:
  bVar40 = pcVar20 != (char *)0x0;
LAB_0152dc13:
  bVar4 = true;
  if (!bVar40) {
joined_r0x0152dc1e:
    do {
      if (pcVar34 == (char *)0x0) goto switchD_0152b780_default;
      bVar26 = *(byte *)&this_02->_vptr_BaseScanner;
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (bVar26 == 0x2d) {
          pcVar36 = &DAT_00000001;
          if (pcVar34 == &DAT_00000001) goto LAB_0152e7a0;
          pcVar12 = &DAT_00000001;
          lVar35 = -2;
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_0152dc92;
        }
        if ((pcVar34 == &DAT_00000001) || (bVar26 != 0x30)) {
          if (bVar26 == 0x2b) goto switchD_0152b780_default;
        }
        else {
          bVar26 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
          if (bVar26 < 0x62) {
            if (bVar26 == 0x42) {
LAB_0152f081:
              pcVar20 = pcVar34 + -1;
              if (pcVar20 < (char *)0x2) goto LAB_0152f107;
              pcVar34 = &DAT_00000001;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0152f09e;
            }
            if (bVar26 == 0x58) {
LAB_0152e9d4:
              pcVar34 = pcVar34 + -1;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              pcVar20 = &DAT_00000001;
              goto LAB_0152e9f6;
            }
          }
          else {
            if (bVar26 == 0x62) goto LAB_0152f081;
            if (bVar26 == 0x78) goto LAB_0152e9d4;
          }
          if ((byte)(bVar26 - 0x30) < 10) goto switchD_0152b780_default;
        }
        lVar35 = -1;
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        pcVar12 = (char *)0x0;
        goto LAB_0152dd58;
      }
      this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
      pcVar34 = pcVar34 + -1;
    } while( true );
  }
  goto LAB_0152fa07;
  while( true ) {
    if ((long)local_128.type_._0_8_ < (long)((ulong)bVar29 + 0x8000000000000000) / 10)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)bVar29;
    lVar35 = lVar35 + -1;
    pcVar36 = pcVar34;
    if (pcVar34 == pcVar12) break;
LAB_0152dc92:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar12 = (char *)-lVar35;
      pcVar36 = pcVar12;
      if (pcVar12 < pcVar34) {
        pbVar10 = (byte *)((long)this_02 - lVar35);
        goto LAB_0152e77b;
      }
      break;
    }
  }
  goto LAB_0152e7a0;
  while( true ) {
    pcVar12 = pcVar12 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar36 = pcVar34;
    if (pcVar34 <= pcVar12) break;
LAB_0152e77b:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152e7a0:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,true>
                    ((IntegerDecimalCastData<long> *)&local_128);
  goto LAB_0152f80d;
  while( true ) {
    pcVar12 = pcVar34 + 1;
    if ((((pcVar20 != pcVar12) &&
         (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] == '_')) &&
        ((pcVar12 = pcVar34 + 2, pcVar20 == pcVar12 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] & 0xfe) != 0x30)))
        ) || (pcVar34 = pcVar12, 0x3fffffffffffffff < (long)local_128.type_._0_8_))
    goto LAB_0152fa00;
    local_128.type_._0_8_ = lVar35 + local_128.type_._0_8_ * 2;
    if (pcVar20 <= pcVar34) break;
LAB_0152f09e:
    cVar17 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar34];
    if (cVar17 == '0') {
      lVar35 = 0;
    }
    else {
      if (cVar17 != '1') goto LAB_0152fa00;
      lVar35 = 1;
    }
  }
LAB_0152f107:
  bVar40 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                     ((IntegerDecimalCastData<long> *)&local_128);
  goto LAB_0152fce3;
LAB_0152e9f6:
  do {
    if (pcVar34 <= pcVar20) {
      bVar40 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                         ((IntegerDecimalCastData<long> *)&local_128);
      goto LAB_0152fce3;
    }
    bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar12 = pcVar20 + 1;
    if ((pcVar34 == pcVar12) ||
       (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] != '_')) {
LAB_0152ea9a:
      uVar8 = (ulong)((byte)(cVar17 + bVar29) >> 4) ^ 0x7ffffffffffffff;
      pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_128.type_._0_8_;
      if ((long)local_128.type_._0_8_ <= (long)uVar8) {
        pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  (local_128.type_._0_8_ * 0x10 + (ulong)(byte)(cVar17 + bVar29));
      }
      bVar4 = (long)local_128.type_._0_8_ <= (long)uVar8;
      local_128.type_._0_8_ = pp_Var9;
    }
    else {
      pcVar12 = pcVar20 + 2;
      if (pcVar34 != pcVar12) {
        bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar4 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152eabf;
        }
        goto LAB_0152ea9a;
      }
      bVar4 = false;
    }
LAB_0152eabf:
    pcVar20 = pcVar12;
  } while (bVar4);
  goto LAB_0152fa00;
  while( true ) {
    if ((long)(((ulong)bVar29 ^ 0x7ffffffffffffffe) / 10) < (long)local_128.type_._0_8_)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = (ulong)bVar29 + local_128.type_._0_8_ * 10;
    lVar35 = lVar35 + -1;
    if (pcVar34 == pcVar12) break;
LAB_0152dd58:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar36 = (char *)-lVar35;
      if (pcVar34 <= pcVar36) goto LAB_0152f489;
      pbVar10 = (byte *)((long)this_02 - lVar35);
      goto LAB_0152f464;
    }
  }
  goto LAB_0152dd9b;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar34 <= pcVar36) break;
LAB_0152f464:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152dd9b:
  pcVar36 = &DAT_00000001;
LAB_0152f489:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<long>,false>
                    ((IntegerDecimalCastData<long> *)&local_128);
  goto LAB_0152f58e;
  while( true ) {
    if (iVar22 < (int)(bVar29 + 0x80000000) / 10) goto joined_r0x0152e1aa;
    pcVar36 = pcVar36 + 1;
    iVar22 = iVar22 * 10 - (uint)bVar29;
    lVar35 = lVar35 + -1;
    pcVar20 = pcVar12;
    if (pcVar12 == pcVar36) break;
LAB_0152bda9:
    bVar26 = pcVar36[(long)(&pBVar13->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152e1aa;
      pcVar36 = (char *)-lVar35;
      pcVar20 = pcVar36;
      if (pcVar36 < pcVar12) {
        pbVar10 = (byte *)((long)pBVar13 - lVar35);
        goto LAB_0152cb68;
      }
      break;
    }
  }
  goto LAB_0152cb91;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar20 = pcVar12;
    if (pcVar12 <= pcVar36) break;
LAB_0152cb68:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152e1aa;
  }
LAB_0152cb91:
  bVar40 = &DAT_00000001 < pcVar20;
  goto LAB_0152e19f;
  while( true ) {
    pcVar36 = pcVar20 + 1;
    if ((((pcVar12 != pcVar36) &&
         (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] == '_')) &&
        ((pcVar36 = pcVar20 + 2, pcVar12 == pcVar36 ||
         ((((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] & 0xfe) != 0x30)))
        ) || (pcVar20 = pcVar36, 0x3fffffff < iVar22)) goto joined_r0x0152e1aa;
    iVar22 = iVar16 + iVar22 * 2;
    if (pcVar12 <= pcVar20) break;
LAB_0152d68d:
    cVar17 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    iVar16 = 0;
    if (cVar17 != '0') {
      if (cVar17 != '1') goto joined_r0x0152e1aa;
      iVar16 = 1;
    }
  }
  goto LAB_0152fa07;
LAB_0152d245:
  do {
    if (pcVar12 <= pcVar20) goto LAB_0152cb91;
    bVar26 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar36 = pcVar20 + 1;
    if ((pcVar12 == pcVar36) ||
       (((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar36] != '_')) {
LAB_0152d2f0:
      pcVar20 = pcVar36;
      uVar31 = (byte)(cVar17 + bVar29) >> 4 ^ 0x7ffffff;
      iVar16 = iVar22;
      if (iVar22 <= (int)uVar31) {
        iVar16 = iVar22 * 0x10 + (uint)(byte)(cVar17 + bVar29);
      }
      bVar40 = iVar22 <= (int)uVar31;
      iVar22 = iVar16;
    }
    else {
      pcVar20 = pcVar20 + 2;
      if (pcVar12 != pcVar20) {
        bVar26 = ((undefined1 *)((long)&pBVar13->_vptr_BaseScanner + 1))[(long)pcVar20];
        pcVar36 = pcVar20;
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar40 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152d319;
        }
        goto LAB_0152d2f0;
      }
      bVar40 = false;
    }
LAB_0152d319:
  } while (bVar40);
  goto joined_r0x0152e1aa;
  while( true ) {
    if ((int)((bVar29 ^ 0x7ffffffe) / 10) < iVar22) goto joined_r0x0152e1aa;
    pcVar20 = pcVar20 + 1;
    iVar22 = (uint)bVar29 + iVar22 * 10;
    lVar35 = lVar35 + -1;
    if (pcVar12 == pcVar20) break;
LAB_0152c925:
    bVar26 = pcVar20[(long)(&pBVar13->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto joined_r0x0152e1aa;
      pcVar20 = (char *)-lVar35;
      if (pcVar12 <= pcVar20) goto LAB_0152e199;
      pbVar10 = (byte *)((long)pBVar13 - lVar35);
      goto LAB_0152e177;
    }
  }
  goto LAB_0152c96c;
  while( true ) {
    pcVar20 = pcVar20 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar12 <= pcVar20) break;
LAB_0152e177:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto joined_r0x0152e1aa;
  }
LAB_0152c96c:
  pcVar20 = &DAT_00000001;
LAB_0152e199:
  bVar40 = pcVar20 != (char *)0x0;
LAB_0152e19f:
  if (!bVar40) {
joined_r0x0152e1aa:
    do {
      if (pcVar34 == (char *)0x0) goto switchD_0152b780_default;
      bVar26 = *(byte *)&this_02->_vptr_BaseScanner;
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (bVar26 == 0x2d) {
          pcVar36 = &DAT_00000001;
          if (pcVar34 == &DAT_00000001) goto LAB_0152e7f3;
          pcVar12 = &DAT_00000001;
          lVar35 = -2;
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_0152e21e;
        }
        if ((pcVar34 == &DAT_00000001) || (bVar26 != 0x30)) {
          if (bVar26 == 0x2b) goto switchD_0152b780_default;
        }
        else {
          bVar26 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
          if (bVar26 < 0x62) {
            if (bVar26 == 0x42) {
LAB_0152f116:
              pcVar20 = pcVar34 + -1;
              if (pcVar20 < (char *)0x2) goto LAB_0152f19c;
              pcVar34 = &DAT_00000001;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0152f133;
            }
            if (bVar26 == 0x58) {
LAB_0152eadf:
              pcVar34 = pcVar34 + -1;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              pcVar20 = &DAT_00000001;
              goto LAB_0152eb01;
            }
          }
          else {
            if (bVar26 == 0x62) goto LAB_0152f116;
            if (bVar26 == 0x78) goto LAB_0152eadf;
          }
          if ((byte)(bVar26 - 0x30) < 10) goto switchD_0152b780_default;
        }
        lVar35 = -1;
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        pcVar12 = (char *)0x0;
        goto LAB_0152e2e4;
      }
      this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
      pcVar34 = pcVar34 + -1;
    } while( true );
  }
  goto LAB_0152fa07;
  while( true ) {
    if ((long)local_128.type_._0_8_ < (long)((ulong)bVar29 + 0x8000000000000000) / 10)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)bVar29;
    lVar35 = lVar35 + -1;
    pcVar36 = pcVar34;
    if (pcVar34 == pcVar12) break;
LAB_0152e21e:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar12 = (char *)-lVar35;
      pcVar36 = pcVar12;
      if (pcVar12 < pcVar34) {
        pbVar10 = (byte *)((long)this_02 - lVar35);
        goto LAB_0152e7ce;
      }
      break;
    }
  }
  goto LAB_0152e7f3;
  while( true ) {
    pcVar12 = pcVar12 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar36 = pcVar34;
    if (pcVar34 <= pcVar12) break;
LAB_0152e7ce:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152e7f3:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,true>
                    ((IntegerDecimalCastData<int> *)&local_128);
  goto LAB_0152f80d;
  while( true ) {
    pcVar12 = pcVar34 + 1;
    if ((((pcVar20 != pcVar12) &&
         (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] == '_')) &&
        ((pcVar12 = pcVar34 + 2, pcVar20 == pcVar12 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] & 0xfe) != 0x30)))
        ) || (pcVar34 = pcVar12, 0x3fffffffffffffff < (long)local_128.type_._0_8_))
    goto LAB_0152fa00;
    local_128.type_._0_8_ = lVar35 + local_128.type_._0_8_ * 2;
    if (pcVar20 <= pcVar34) break;
LAB_0152f133:
    cVar17 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar34];
    if (cVar17 == '0') {
      lVar35 = 0;
    }
    else {
      if (cVar17 != '1') goto LAB_0152fa00;
      lVar35 = 1;
    }
  }
LAB_0152f19c:
  bVar40 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                     ((IntegerDecimalCastData<int> *)&local_128);
  goto LAB_0152fce3;
LAB_0152eb01:
  do {
    if (pcVar34 <= pcVar20) {
      bVar40 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                         ((IntegerDecimalCastData<int> *)&local_128);
      goto LAB_0152fce3;
    }
    bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar12 = pcVar20 + 1;
    if ((pcVar34 == pcVar12) ||
       (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] != '_')) {
LAB_0152eba5:
      uVar8 = (ulong)((byte)(cVar17 + bVar29) >> 4) ^ 0x7ffffffffffffff;
      pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_128.type_._0_8_;
      if ((long)local_128.type_._0_8_ <= (long)uVar8) {
        pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  (local_128.type_._0_8_ * 0x10 + (ulong)(byte)(cVar17 + bVar29));
      }
      bVar4 = (long)local_128.type_._0_8_ <= (long)uVar8;
      local_128.type_._0_8_ = pp_Var9;
    }
    else {
      pcVar12 = pcVar20 + 2;
      if (pcVar34 != pcVar12) {
        bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar4 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152ebca;
        }
        goto LAB_0152eba5;
      }
      bVar4 = false;
    }
LAB_0152ebca:
    pcVar20 = pcVar12;
  } while (bVar4);
  goto LAB_0152fa00;
  while( true ) {
    if ((long)(((ulong)bVar29 ^ 0x7ffffffffffffffe) / 10) < (long)local_128.type_._0_8_)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = (ulong)bVar29 + local_128.type_._0_8_ * 10;
    lVar35 = lVar35 + -1;
    if (pcVar34 == pcVar12) break;
LAB_0152e2e4:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar36 = (char *)-lVar35;
      if (pcVar34 <= pcVar36) goto LAB_0152f4dc;
      pbVar10 = (byte *)((long)this_02 - lVar35);
      goto LAB_0152f4b7;
    }
  }
  goto LAB_0152e327;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar34 <= pcVar36) break;
LAB_0152f4b7:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152e327:
  pcVar36 = &DAT_00000001;
LAB_0152f4dc:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<int>,false>
                    ((IntegerDecimalCastData<int> *)&local_128);
  goto LAB_0152f58e;
LAB_0152e484:
  do {
    pcVar38 = pcVar36 + (long)this_02;
    if ((pcVar12 + 1)[(long)pcVar38] != '0') {
      if ((pcVar12 + 1)[(long)pcVar38] == '1') {
        sVar15 = 1;
        goto LAB_0152e4a4;
      }
LAB_0152fcef:
      local_d0.type_.id_ = (char)local_d0.type_._0_2_;
      local_d0.type_.physical_type_ = (char)((ushort)local_d0.type_._0_2_ >> 8);
      goto joined_r0x0152c62b;
    }
    sVar15 = 0;
LAB_0152e4a4:
    pcVar30 = pcVar36 + 1;
    if ((pcVar34 + (-2 - (long)pcVar36) != pcVar12) && ((pcVar12 + 2)[(long)pcVar38] == '_')) {
      if ((pcVar34 + (-3 - (long)pcVar36) == pcVar12) ||
         (((pcVar12 + 3)[(long)pcVar38] & 0xfeU) != 0x30)) goto LAB_0152fcef;
      pcVar30 = pcVar36 + 2;
    }
    pcVar36 = pcVar30;
    if (0x3fff < (short)local_d0.type_._0_2_) goto LAB_0152fcef;
    local_d0.type_._0_2_ = sVar15 + local_d0.type_._0_2_ * 2;
  } while (pcVar36 < pcVar20);
switchD_0152b763_caseD_19:
  bVar4 = true;
  goto LAB_0152fa07;
LAB_0152e361:
  do {
    sVar15 = (short)iVar16;
    if (pcVar34 + ~(ulong)pcVar12 <= pcVar20) {
      local_d0.type_.id_ = (char)sVar15;
      local_d0.type_.physical_type_ = (char)((ushort)sVar15 >> 8);
      bVar40 = &DAT_00000001 < pcVar20;
LAB_0152c61d:
      bVar4 = true;
      if (bVar40 != false) goto LAB_0152fa07;
      goto joined_r0x0152c62b;
    }
    pcVar36 = pcVar20 + (long)this_02;
    bVar26 = (pcVar12 + 1)[(long)pcVar36];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar38 = pcVar20 + 1;
    if ((pcVar34 + (-2 - (long)pcVar20) == pcVar12) || ((pcVar12 + 2)[(long)pcVar36] != '_')) {
LAB_0152e41f:
      bVar4 = (int)(short)iVar22 <= (int)((byte)(cVar17 + bVar29) >> 4 ^ 0x7ff);
      if (bVar4) {
        iVar16 = (short)iVar22 * 0x10 + (uint)(byte)(cVar17 + bVar29);
        iVar22 = iVar16;
      }
    }
    else {
      pcVar38 = pcVar20 + 2;
      if (pcVar34 + (-3 - (long)pcVar20) != pcVar12) {
        if (9 < (byte)((pcVar12 + 3)[(long)pcVar36] - 0x30U)) {
          bVar4 = false;
          uVar31 = (byte)(pcVar12 + 3)[(long)pcVar36] - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152e454;
        }
        goto LAB_0152e41f;
      }
      bVar4 = false;
    }
LAB_0152e454:
    sVar15 = (short)iVar16;
    pcVar20 = pcVar38;
  } while (bVar4);
  local_d0.type_.id_ = (char)sVar15;
  local_d0.type_.physical_type_ = (char)((ushort)sVar15 >> 8);
joined_r0x0152c62b:
  do {
    if (pcVar34 == (char *)0x0) goto switchD_0152b780_default;
    bVar26 = *(byte *)&this_02->_vptr_BaseScanner;
    if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (bVar26 == 0x2d) {
        pcVar36 = &DAT_00000001;
        if (pcVar34 == &DAT_00000001) goto LAB_0152e5ef;
        pcVar12 = &DAT_00000001;
        lVar35 = -2;
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        break;
      }
      if ((pcVar34 == &DAT_00000001) || (bVar26 != 0x30)) {
        if (bVar26 == 0x2b) goto switchD_0152b780_default;
      }
      else {
        bVar26 = *(byte *)((long)&this_02->_vptr_BaseScanner + 1);
        if (bVar26 < 0x62) {
          if (bVar26 == 0x42) {
LAB_0152ef57:
            pcVar20 = pcVar34 + -1;
            if (pcVar20 < (char *)0x2) goto LAB_0152efdd;
            pcVar34 = &DAT_00000001;
            local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
            goto LAB_0152ef74;
          }
          if (bVar26 == 0x58) {
LAB_0152e610:
            pcVar34 = pcVar34 + -1;
            local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
            pcVar20 = &DAT_00000001;
            goto LAB_0152e632;
          }
        }
        else {
          if (bVar26 == 0x62) goto LAB_0152ef57;
          if (bVar26 == 0x78) goto LAB_0152e610;
        }
        if ((byte)(bVar26 - 0x30) < 10) goto switchD_0152b780_default;
      }
      lVar35 = -1;
      local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
      pcVar12 = (char *)0x0;
      goto LAB_0152d77e;
    }
    this_02 = (BaseScanner *)((long)&this_02->_vptr_BaseScanner + 1);
    pcVar34 = pcVar34 + -1;
  } while( true );
  while( true ) {
    if ((long)local_128.type_._0_8_ < (long)((ulong)bVar29 + 0x8000000000000000) / 10)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)bVar29;
    lVar35 = lVar35 + -1;
    pcVar36 = pcVar34;
    if (pcVar34 == pcVar12) break;
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar12 = (char *)-lVar35;
      pcVar36 = pcVar12;
      if (pcVar12 < pcVar34) {
        pbVar10 = (byte *)((long)this_02 - lVar35);
        goto LAB_0152e5ca;
      }
      break;
    }
  }
  goto LAB_0152e5ef;
  while( true ) {
    pcVar12 = pcVar12 + 1;
    pbVar10 = pbVar10 + 1;
    pcVar36 = pcVar34;
    if (pcVar34 <= pcVar12) break;
LAB_0152e5ca:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152e5ef:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,true>
                    ((IntegerDecimalCastData<short> *)&local_128);
LAB_0152f80d:
  bVar40 = &DAT_00000001 < pcVar36;
  goto LAB_0152fce7;
  while( true ) {
    pcVar12 = pcVar34 + 1;
    if ((((pcVar20 != pcVar12) &&
         (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] == '_')) &&
        ((pcVar12 = pcVar34 + 2, pcVar20 == pcVar12 ||
         ((((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] & 0xfe) != 0x30)))
        ) || (pcVar34 = pcVar12, 0x3fffffffffffffff < (long)local_128.type_._0_8_))
    goto LAB_0152fa00;
    local_128.type_._0_8_ = lVar35 + local_128.type_._0_8_ * 2;
    if (pcVar20 <= pcVar34) break;
LAB_0152ef74:
    cVar17 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar34];
    if (cVar17 == '0') {
      lVar35 = 0;
    }
    else {
      if (cVar17 != '1') goto LAB_0152fa00;
      lVar35 = 1;
    }
  }
LAB_0152efdd:
  bVar40 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                     ((IntegerDecimalCastData<short> *)&local_128);
  goto LAB_0152fce3;
LAB_0152e632:
  do {
    if (pcVar34 <= pcVar20) {
      bVar40 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                         ((IntegerDecimalCastData<short> *)&local_128);
      goto LAB_0152fce3;
    }
    bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar20];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar12 = pcVar20 + 1;
    if ((pcVar34 == pcVar12) ||
       (((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12] != '_')) {
LAB_0152e6d6:
      uVar8 = (ulong)((byte)(cVar17 + bVar29) >> 4) ^ 0x7ffffffffffffff;
      pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_128.type_._0_8_;
      if ((long)local_128.type_._0_8_ <= (long)uVar8) {
        pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  (local_128.type_._0_8_ * 0x10 + (ulong)(byte)(cVar17 + bVar29));
      }
      bVar4 = (long)local_128.type_._0_8_ <= (long)uVar8;
      local_128.type_._0_8_ = pp_Var9;
    }
    else {
      pcVar12 = pcVar20 + 2;
      if (pcVar34 != pcVar12) {
        bVar26 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar4 = false;
          uVar31 = bVar26 - 0x41;
          if ((0x25 < uVar31) || ((0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152e6fb;
        }
        goto LAB_0152e6d6;
      }
      bVar4 = false;
    }
LAB_0152e6fb:
    pcVar20 = pcVar12;
  } while (bVar4);
  goto LAB_0152fa00;
  while( true ) {
    if ((long)(((ulong)bVar29 ^ 0x7ffffffffffffffe) / 10) < (long)local_128.type_._0_8_)
    goto LAB_0152fdaf;
    pcVar12 = pcVar12 + 1;
    local_128.type_._0_8_ = (ulong)bVar29 + local_128.type_._0_8_ * 10;
    lVar35 = lVar35 + -1;
    if (pcVar34 == pcVar12) break;
LAB_0152d77e:
    bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
    bVar29 = bVar26 - 0x30;
    if (9 < bVar29) {
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) goto switchD_0152b780_default;
      pcVar36 = (char *)-lVar35;
      if (pcVar34 <= pcVar36) goto LAB_0152f3e3;
      pbVar10 = (byte *)((long)this_02 - lVar35);
      goto LAB_0152f3be;
    }
  }
  goto LAB_0152d7c1;
  while( true ) {
    pcVar36 = pcVar36 + 1;
    pbVar10 = pbVar10 + 1;
    if (pcVar34 <= pcVar36) break;
LAB_0152f3be:
    if ((4 < *pbVar10 - 9) && (*pbVar10 != 0x20)) goto switchD_0152b780_default;
  }
LAB_0152d7c1:
  pcVar36 = &DAT_00000001;
LAB_0152f3e3:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<short>,false>
                    ((IntegerDecimalCastData<short> *)&local_128);
LAB_0152f58e:
  bVar40 = pcVar36 != (char *)0x0;
  goto LAB_0152fce7;
LAB_0152fdaf:
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  goto switchD_0152b780_default;
  while( true ) {
    pcVar30 = pcVar20 + 1;
    if ((int)cVar17 < (int)(bVar26 - 0xb0) / 10) {
      bVar40 = false;
    }
    else {
      cVar17 = (cVar17 * '\n' - bVar26) + '0';
      bVar40 = true;
      if ((pcVar34 + ~(ulong)pcVar20 != pcVar12) && ((pcVar12 + 1)[(long)pcVar38] == '_')) {
        pcVar30 = pcVar20 + 2;
        if (pcVar34 + (-2 - (long)pcVar20) == pcVar12) {
          bVar40 = false;
        }
        else {
          bVar40 = (byte)(pcVar12[(long)(pcVar30 + (long)(&this_02->states + -0x20))] - 0x30U) < 10;
        }
      }
    }
    pcVar20 = pcVar30;
    if (!bVar40) break;
LAB_0152babe:
    if (pcVar36 <= pcVar20) goto LAB_0152e8af;
    pcVar38 = pcVar20 + (long)this_02;
    bVar26 = pcVar12[(long)pcVar38];
    if (9 < (byte)(bVar26 - 0x30)) {
      if (bVar26 == 0x2e) {
        pcVar30 = pcVar20 + 1;
        iVar22 = 3;
        if (pcVar30 < pcVar36) {
          iVar22 = 0;
          iVar16 = 1;
          if (9 < (byte)((pcVar12 + 1)[(long)pcVar38] - 0x30U)) goto LAB_0152c9fb;
        }
        else {
LAB_0152c9fb:
          iVar16 = 1;
          if (&DAT_00000001 < pcVar20) {
            iVar16 = iVar22;
          }
        }
        pcVar20 = pcVar30;
        if (iVar16 == 3) goto LAB_0152e8af;
        if (iVar16 != 0) break;
      }
      if (((byte)pcVar12[(long)(pcVar20 + (long)(&this_02->states + -0x20))] - 9 < 5) ||
         (pcVar12[(long)(pcVar20 + (long)(&this_02->states + -0x20))] == 0x20)) {
        pcVar38 = pcVar20 + 1;
        pcVar20 = pcVar38;
        if (pcVar36 <= pcVar38) goto LAB_0152e8af;
        goto LAB_0152d7ef;
      }
      break;
    }
  }
  goto LAB_0152f600;
  while (pcVar38 = pcVar38 + 1, pcVar20 = pcVar36, pcVar36 != pcVar38) {
LAB_0152d7ef:
    if ((4 < (byte)pcVar12[(long)(pcVar38 + (long)(&this_02->states + -0x20))] - 9) &&
       (pcVar12[(long)(pcVar38 + (long)(&this_02->states + -0x20))] != 0x20)) goto LAB_0152f600;
  }
LAB_0152e8af:
  bVar40 = &DAT_00000001 < pcVar20;
  goto LAB_0152f5f8;
  while( true ) {
    pcVar30 = pcVar36 + 1;
    if ((pcVar34 + (-2 - (long)pcVar36) != pcVar12) && ((pcVar12 + 2)[(long)pcVar38] == '_')) {
      if ((pcVar34 + (-3 - (long)pcVar36) == pcVar12) ||
         (((pcVar12 + 3)[(long)pcVar38] & 0xfeU) != 0x30)) goto LAB_0152f600;
      pcVar30 = pcVar36 + 2;
    }
    pcVar36 = pcVar30;
    if ('?' < (char)bVar26) goto LAB_0152f600;
    bVar26 = bVar26 * '\x02' | bVar29;
    if (pcVar20 <= pcVar36) break;
LAB_0152d4f6:
    pcVar38 = pcVar36 + (long)this_02;
    if ((pcVar12 + 1)[(long)pcVar38] == '0') {
      bVar29 = 0;
    }
    else {
      if ((pcVar12 + 1)[(long)pcVar38] != '1') goto LAB_0152f600;
      bVar29 = 1;
    }
  }
  goto LAB_0152fa07;
LAB_0152cf0b:
  do {
    if (pcVar34 + ~(ulong)pcVar12 <= pcVar20) goto LAB_0152e8af;
    pcVar36 = pcVar20 + (long)this_02;
    bVar26 = (pcVar12 + 1)[(long)pcVar36];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar28 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar28 = -0x30;
    }
    pcVar38 = pcVar20 + 1;
    if ((pcVar34 + (-2 - (long)pcVar20) == pcVar12) || ((pcVar12 + 2)[(long)pcVar36] != '_')) {
LAB_0152cfc8:
      bVar29 = cVar28 + bVar29;
      iVar16 = 0x7f - (uint)bVar29;
      iVar22 = 0x8e - (uint)bVar29;
      if (-1 < iVar16) {
        iVar22 = iVar16;
      }
      bVar40 = (int)cVar17 <= iVar22 >> 4;
      if (bVar40) {
        cVar17 = bVar29 + cVar17 * '\x10';
      }
    }
    else {
      pcVar38 = pcVar20 + 2;
      if (pcVar34 + (-3 - (long)pcVar20) != pcVar12) {
        if (9 < (byte)((pcVar12 + 3)[(long)pcVar36] - 0x30U)) {
          uVar31 = (byte)(pcVar12 + 3)[(long)pcVar36] - 0x41;
          bVar40 = false;
          if ((0x25 < uVar31) ||
             (bVar40 = false, (0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0))
          goto LAB_0152d007;
        }
        goto LAB_0152cfc8;
      }
      bVar40 = false;
    }
LAB_0152d007:
    pcVar20 = pcVar38;
  } while (bVar40);
  goto LAB_0152f600;
  while( true ) {
    uVar25 = uVar8 + 1;
    if ((char)((bVar26 ^ 0x7e) / 10) < cVar17) {
      bVar40 = false;
    }
    else {
      cVar17 = bVar26 + cVar17 * '\n';
      bVar40 = true;
      if ((pcVar34 + ~uVar8 != pcVar12) && ((pcVar12 + 1)[lVar35] == '_')) {
        uVar25 = uVar8 + 2;
        if (pcVar34 + (-2 - uVar8) == pcVar12) {
          bVar40 = false;
        }
        else {
          bVar40 = (byte)(pcVar12[(long)((long)(&this_02->states + -0x1f) + uVar8)] - 0x30U) < 10;
        }
      }
    }
    uVar8 = uVar25;
    if (!bVar40) break;
LAB_0152c42f:
    if (uVar14 <= uVar8) goto LAB_0152f5f2;
    lVar35 = (long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar8;
    bVar26 = pcVar12[lVar35] - 0x30;
    if (9 < bVar26) {
      if (pcVar12[lVar35] == '.') {
        uVar25 = uVar8 + 1;
        iVar22 = 3;
        if (uVar25 < uVar14) {
          iVar22 = 0;
          iVar16 = 1;
          if (9 < (byte)((pcVar12 + 1)[lVar35] - 0x30U)) goto LAB_0152d72e;
        }
        else {
LAB_0152d72e:
          iVar16 = 1;
          if (uVar19 < uVar8) {
            iVar16 = iVar22;
          }
        }
        uVar8 = uVar25;
        if (iVar16 == 3) goto LAB_0152f5f2;
        if (iVar16 != 0) break;
      }
      if (((byte)pcVar12[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner +
                         uVar8] - 9 < 5) ||
         (pcVar12[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar8] ==
          0x20)) {
        uVar25 = uVar8 + 1;
        uVar8 = uVar25;
        if (uVar14 <= uVar25) goto LAB_0152f5f2;
        goto LAB_0152e543;
      }
      break;
    }
  }
  goto LAB_0152f600;
  while (uVar25 = uVar25 + 1, uVar8 = uVar14, uVar14 != uVar25) {
LAB_0152e543:
    if ((4 < (byte)pcVar12[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner +
                           uVar25] - 9) &&
       (pcVar12[(long)&((BaseScanner *)(&this_02->states + -0x20))->_vptr_BaseScanner + uVar25] !=
        0x20)) goto LAB_0152f600;
  }
LAB_0152f5f2:
  bVar40 = uVar19 < uVar8;
LAB_0152f5f8:
  if (bVar40) goto LAB_0152fa07;
LAB_0152f600:
  if (pcVar34 != (char *)0x0) {
    pcVar12 = (char *)0x0;
    do {
      bVar26 = pcVar12[(long)(&this_02->states + -0x20)];
      if ((4 < bVar26 - 9) && (bVar26 != 0x20)) {
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pcVar20 = pcVar34 + -(long)pcVar12;
        local_128.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0;
        if (bVar26 == 0x2d) {
          pcVar36 = &DAT_00000001;
          local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
          goto LAB_0152f668;
        }
        if ((pcVar34 + -1 != pcVar12) && (bVar26 == 0x30)) {
          bVar29 = ((undefined1 *)((long)&this_02->_vptr_BaseScanner + 1))[(long)pcVar12];
          if (bVar29 < 0x62) {
            if (bVar29 == 0x42) {
LAB_0152fa54:
              pcVar20 = pcVar34 + ~(ulong)pcVar12;
              if (pcVar20 < (char *)0x2) goto LAB_0152faf8;
              pcVar36 = &DAT_00000001;
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              goto LAB_0152fa7b;
            }
            if (bVar29 == 0x58) {
LAB_0152f8ea:
              local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
              pcVar20 = &DAT_00000001;
              goto LAB_0152f912;
            }
          }
          else {
            if (bVar29 == 0x62) goto LAB_0152fa54;
            if (bVar29 == 0x78) goto LAB_0152f8ea;
          }
        }
        pcVar38 = (char *)(ulong)(bVar26 == 0x2b);
        local_128.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)0x0;
        pcVar36 = pcVar38;
        goto LAB_0152f75b;
      }
      pcVar12 = pcVar12 + 1;
    } while (pcVar34 != pcVar12);
  }
  goto switchD_0152b780_default;
  while( true ) {
    bVar26 = pcVar12[(long)(pcVar36 + (long)this_02)] - 0x30;
    if (9 < bVar26) {
      if (pcVar12[(long)(pcVar36 + (long)this_02)] != '.') goto LAB_0152fdf3;
      pcVar38 = pcVar36 + 1;
      iVar22 = 3;
      pcVar30 = pcVar38;
      if (pcVar20 <= pcVar38) goto LAB_0152fdc8;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_0152f844;
    }
    pcVar38 = pcVar36 + 1;
    if ((long)local_128.type_._0_8_ < (long)((ulong)bVar26 + 0x8000000000000000) / 10) {
      bVar4 = false;
    }
    else {
      local_128.type_._0_8_ = local_128.type_._0_8_ * 10 - (ulong)bVar26;
      bVar4 = true;
      if ((pcVar34 + ~(ulong)pcVar36 != pcVar12) &&
         ((pcVar12 + 1)[(long)(pcVar36 + (long)this_02)] == '_')) {
        pcVar38 = pcVar36 + 2;
        if (pcVar34 + (-2 - (long)pcVar36) == pcVar12) {
          bVar4 = false;
        }
        else {
          bVar4 = (byte)(pcVar12[(long)(pcVar38 + (long)(&this_02->states + -0x20))] - 0x30U) < 10;
        }
      }
    }
    pcVar36 = pcVar38;
    if (!bVar4) break;
LAB_0152f668:
    if (pcVar20 <= pcVar36) goto LAB_0152f7fd;
  }
  goto switchD_0152b780_default;
  while (pcVar30 = pcVar39, pcVar39 < pcVar20) {
LAB_0152f844:
    bVar26 = pcVar12[(long)(pcVar30 + (long)this_02)] - 0x30;
    if (9 < bVar26) {
      iVar22 = 0;
      goto LAB_0152fdbe;
    }
    if ((long)local_128.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr <=
        (long)(((ulong)bVar26 ^ 0x7ffffffffffffffe) / 10)) {
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_2_
           = local_128.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ._0_2_ + 1;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((long)local_128.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 10
           + (ulong)bVar26);
    }
    pcVar39 = pcVar30 + 1;
    if (((pcVar34 + ~(ulong)pcVar30 != pcVar12) &&
        ((pcVar12 + 1)[(long)(pcVar30 + (long)this_02)] == '_')) &&
       ((pcVar39 = pcVar30 + 2, pcVar34 + (-2 - (long)pcVar30) == pcVar12 ||
        (9 < (byte)(pcVar12[(long)(pcVar39 + (long)(&this_02->states + -0x20))] - 0x30U))))) {
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_6_
           = 0;
      pcVar30 = pcVar39;
      iVar16 = 1;
      goto LAB_0152fde0;
    }
  }
  iVar22 = 3;
LAB_0152fdbe:
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_6_ = 0;
LAB_0152fdc8:
  iVar16 = 1;
  if (pcVar38 < pcVar30) {
    iVar16 = iVar22;
  }
  if (&DAT_00000001 < pcVar36) {
    iVar16 = iVar22;
  }
LAB_0152fde0:
  pcVar36 = pcVar30;
  if (iVar16 != 3) {
    if (iVar16 != 0) goto switchD_0152b780_default;
LAB_0152fdf3:
    bVar26 = pcVar12[(long)(pcVar36 + (long)(&this_02->states + -0x20))];
    bVar4 = false;
    uVar31 = (uint)bVar26;
    if (bVar26 < 0x20) {
      if (4 < uVar31 - 9) goto LAB_0152fa07;
    }
    else {
      if ((bVar26 == 0x65) || (uVar31 == 0x45)) {
        if ((pcVar36 != &DAT_00000001) && (pcVar36 + 1 < pcVar20)) {
          local_d0.type_.id_ = INVALID;
          local_d0.type_.physical_type_ = ~INVALID;
          pcVar20 = pcVar12 + (long)(pcVar36 + (long)(&this_02->states + -0x20)) + 1;
          if (*pcVar20 == '-') {
            bVar40 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar20,(idx_t)(pcVar34 + (~(ulong)pcVar12 - (long)pcVar36)),
                                (IntegerCastData<short> *)&local_d0,false);
          }
          else {
            bVar40 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar20,(idx_t)(pcVar34 + (~(ulong)pcVar12 - (long)pcVar36)),
                                (IntegerCastData<short> *)&local_d0,false);
          }
          bVar4 = false;
          if (bVar40 != false) {
            bVar4 = IntegerDecimalCastOperation::
                    HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,true>
                              ((IntegerDecimalCastData<signed_char> *)&local_128,
                               local_d0.type_._0_2_);
          }
          goto LAB_0152fa07;
        }
        goto switchD_0152b780_default;
      }
      bVar4 = false;
      if (uVar31 != 0x20) goto LAB_0152fa07;
    }
    pcVar34 = pcVar36 + 1;
    pcVar36 = pcVar34;
    if (pcVar34 < pcVar20) {
      do {
        if ((4 < (byte)pcVar12[(long)(pcVar34 + (long)(&this_02->states + -0x20))] - 9) &&
           (pcVar12[(long)(pcVar34 + (long)(&this_02->states + -0x20))] != 0x20))
        goto switchD_0152b780_default;
        pcVar34 = pcVar34 + 1;
        pcVar36 = pcVar20;
      } while (pcVar20 != pcVar34);
    }
  }
LAB_0152f7fd:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,true>
                    ((IntegerDecimalCastData<signed_char> *)&local_128);
  goto LAB_0152f80d;
  while( true ) {
    pcVar30 = pcVar36 + 1;
    if ((pcVar34 + (-2 - (long)pcVar36) != pcVar12) && ((pcVar12 + 2)[(long)pcVar38] == '_')) {
      if ((pcVar34 + (-3 - (long)pcVar36) == pcVar12) ||
         (((pcVar12 + 3)[(long)pcVar38] & 0xfeU) != 0x30)) goto LAB_0152fa00;
      pcVar30 = pcVar36 + 2;
    }
    pcVar36 = pcVar30;
    if (0x3fffffffffffffff < (long)local_128.type_._0_8_) goto LAB_0152fa00;
    local_128.type_._0_8_ = lVar35 + local_128.type_._0_8_ * 2;
    if (pcVar20 <= pcVar36) break;
LAB_0152fa7b:
    pcVar38 = pcVar36 + (long)this_02;
    if ((pcVar12 + 1)[(long)pcVar38] == '0') {
      lVar35 = 0;
    }
    else {
      if ((pcVar12 + 1)[(long)pcVar38] != '1') goto LAB_0152fa00;
      lVar35 = 1;
    }
  }
LAB_0152faf8:
  bVar40 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                     ((IntegerDecimalCastData<signed_char> *)&local_128);
LAB_0152fce3:
  bVar4 = &DAT_00000001 < pcVar20;
LAB_0152fce7:
  bVar4 = (bool)(bVar4 & bVar40);
  goto LAB_0152fa07;
  while( true ) {
    bVar26 = pcVar12[(long)(pcVar36 + (long)this_02)] - 0x30;
    if (9 < bVar26) {
      if (pcVar12[(long)(pcVar36 + (long)this_02)] != '.') goto LAB_0152fee5;
      pcVar30 = pcVar36 + 1;
      iVar22 = 3;
      pcVar39 = pcVar30;
      if (pcVar20 <= pcVar30) goto LAB_0152fec0;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_70 = pcVar30;
      goto LAB_0152fb3e;
    }
    pcVar30 = pcVar36 + 1;
    if ((long)(((ulong)bVar26 ^ 0x7ffffffffffffffe) / 10) < (long)local_128.type_._0_8_) {
      bVar4 = false;
    }
    else {
      local_128.type_._0_8_ = (ulong)bVar26 + local_128.type_._0_8_ * 10;
      bVar4 = true;
      if ((pcVar34 + ~(ulong)pcVar36 != pcVar12) &&
         ((pcVar12 + 1)[(long)(pcVar36 + (long)this_02)] == '_')) {
        pcVar30 = pcVar36 + 2;
        if (pcVar34 + (-2 - (long)pcVar36) == pcVar12) {
          bVar4 = false;
        }
        else {
          bVar4 = (byte)(pcVar12[(long)(pcVar30 + (long)(&this_02->states + -0x20))] - 0x30U) < 10;
        }
      }
    }
    pcVar36 = pcVar30;
    if (!bVar4) break;
LAB_0152f75b:
    if (pcVar20 <= pcVar36) goto LAB_0152fa3d;
  }
  goto switchD_0152b780_default;
  while (pcVar39 = pcVar33, pcVar33 < pcVar20) {
LAB_0152fb3e:
    bVar26 = pcVar12[(long)(pcVar39 + (long)this_02)] - 0x30;
    if (9 < bVar26) {
      iVar22 = 0;
      goto LAB_0152feae;
    }
    if ((long)local_128.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr <=
        (long)(((ulong)bVar26 ^ 0x7ffffffffffffffe) / 10)) {
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_2_
           = local_128.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ._0_2_ + 1;
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((ulong)bVar26 +
           (long)local_128.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 10);
    }
    pcVar33 = pcVar39 + 1;
    if (((pcVar34 + ~(ulong)pcVar39 != pcVar12) &&
        ((pcVar12 + 1)[(long)(pcVar39 + (long)this_02)] == '_')) &&
       ((pcVar33 = pcVar39 + 2, pcVar34 + (-2 - (long)pcVar39) == pcVar12 ||
        (9 < (byte)(pcVar12[(long)(pcVar33 + (long)(&this_02->states + -0x20))] - 0x30U))))) {
      local_128.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_6_
           = 0;
      pcVar39 = pcVar33;
      iVar16 = 1;
      goto LAB_0152fed4;
    }
  }
  iVar22 = 3;
LAB_0152feae:
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_6_ = 0;
LAB_0152fec0:
  iVar16 = 1;
  if (pcVar30 < pcVar39) {
    iVar16 = iVar22;
  }
  if (pcVar38 < pcVar36) {
    iVar16 = iVar22;
  }
LAB_0152fed4:
  pcVar36 = pcVar39;
  if (iVar16 != 3) {
    if (iVar16 != 0) goto switchD_0152b780_default;
LAB_0152fee5:
    bVar26 = pcVar12[(long)(pcVar36 + (long)(&this_02->states + -0x20))];
    bVar4 = false;
    uVar31 = (uint)bVar26;
    if (bVar26 < 0x20) {
      if (4 < uVar31 - 9) goto LAB_0152fa07;
    }
    else {
      if ((bVar26 == 0x65) || (uVar31 == 0x45)) {
        if ((pcVar36 != pcVar38) && (pcVar36 + 1 < pcVar20)) {
          local_d0.type_.id_ = INVALID;
          local_d0.type_.physical_type_ = ~INVALID;
          pcVar20 = pcVar12 + (long)(pcVar36 + (long)(&this_02->states + -0x20)) + 1;
          if (*pcVar20 == '-') {
            bVar40 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar20,(idx_t)(pcVar34 + (~(ulong)pcVar12 - (long)pcVar36)),
                                (IntegerCastData<short> *)&local_d0,false);
          }
          else {
            bVar40 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar20,(idx_t)(pcVar34 + (~(ulong)pcVar12 - (long)pcVar36)),
                                (IntegerCastData<short> *)&local_d0,false);
          }
          bVar4 = false;
          if (bVar40 != false) {
            bVar4 = IntegerDecimalCastOperation::
                    HandleExponent<duckdb::IntegerDecimalCastData<signed_char>,false>
                              ((IntegerDecimalCastData<signed_char> *)&local_128,
                               local_d0.type_._0_2_);
          }
          goto LAB_0152fa07;
        }
        goto switchD_0152b780_default;
      }
      bVar4 = false;
      if (uVar31 != 0x20) goto LAB_0152fa07;
    }
    pcVar34 = pcVar36 + 1;
    pcVar36 = pcVar34;
    if (pcVar34 < pcVar20) {
      do {
        if ((4 < (byte)pcVar12[(long)(pcVar34 + (long)(&this_02->states + -0x20))] - 9) &&
           (pcVar12[(long)(pcVar34 + (long)(&this_02->states + -0x20))] != 0x20))
        goto switchD_0152b780_default;
        pcVar34 = pcVar34 + 1;
        pcVar36 = pcVar20;
      } while (pcVar20 != pcVar34);
    }
  }
LAB_0152fa3d:
  bVar4 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                    ((IntegerDecimalCastData<signed_char> *)&local_128);
  bVar40 = pcVar38 < pcVar36;
  goto LAB_0152fce7;
LAB_0152f912:
  do {
    if (pcVar34 + ~(ulong)pcVar12 <= pcVar20) {
      bVar40 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<signed_char>,false>
                         ((IntegerDecimalCastData<signed_char> *)&local_128);
      goto LAB_0152fce3;
    }
    pcVar36 = pcVar20 + (long)this_02;
    bVar26 = (pcVar12 + 1)[(long)pcVar36];
    bVar29 = bVar26 | 0x20;
    if (0x19 < (byte)(bVar26 + 0xbf)) {
      bVar29 = bVar26;
    }
    if ((9 < (byte)(bVar29 - 0x30)) &&
       ((0x25 < bVar29 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar29 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar29 < 'a') {
      cVar17 = -0x30;
    }
    pcVar38 = pcVar20 + 1;
    if ((pcVar34 + (-2 - (long)pcVar20) == pcVar12) || ((pcVar12 + 2)[(long)pcVar36] != '_')) {
LAB_0152f9d0:
      uVar8 = (ulong)((byte)(cVar17 + bVar29) >> 4) ^ 0x7ffffffffffffff;
      pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_128.type_._0_8_;
      if ((long)local_128.type_._0_8_ <= (long)uVar8) {
        pp_Var9 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  (local_128.type_._0_8_ * 0x10 + (ulong)(byte)(cVar17 + bVar29));
      }
      bVar4 = (long)local_128.type_._0_8_ <= (long)uVar8;
      local_128.type_._0_8_ = pp_Var9;
    }
    else {
      pcVar38 = pcVar20 + 2;
      if (pcVar34 + (-3 - (long)pcVar20) != pcVar12) {
        if (9 < (byte)((pcVar12 + 3)[(long)pcVar36] - 0x30U)) {
          uVar31 = (byte)(pcVar12 + 3)[(long)pcVar36] - 0x41;
          bVar4 = false;
          if ((0x25 < uVar31) || (bVar4 = false, (0x3f0000003fU >> ((ulong)uVar31 & 0x3f) & 1) == 0)
             ) goto LAB_0152f9f7;
        }
        goto LAB_0152f9d0;
      }
      bVar4 = false;
    }
LAB_0152f9f7:
    pcVar20 = pcVar38;
  } while (bVar4);
LAB_0152fa00:
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
switchD_0152b780_default:
  bVar4 = false;
LAB_0152fa07:
  if (local_68 != (BaseScanner *)local_58) {
    operator_delete(local_68);
  }
  return bVar4;
}

Assistant:

bool CSVSniffer::CanYouCastIt(ClientContext &context, const string_t value, const LogicalType &type,
                              const DialectOptions &dialect_options, const bool is_null, const char decimal_separator,
                              const char thousands_separator) {
	if (is_null) {
		return true;
	}
	auto value_ptr = value.GetData();
	auto value_size = value.GetSize();
	string strip_thousands;
	if (type.IsNumeric() && thousands_separator != '\0') {
		// If we have a thousands separator we should try to use that
		strip_thousands = BaseScanner::RemoveSeparator(value_ptr, value_size, thousands_separator);
		value_ptr = strip_thousands.c_str();
		value_size = strip_thousands.size();
	}
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN: {
		bool dummy_value;
		return TryCastStringBool(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::TINYINT: {
		int8_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, false);
	}
	case LogicalTypeId::SMALLINT: {
		int16_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::INTEGER: {
		int32_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::BIGINT: {
		int64_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UTINYINT: {
		uint8_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::USMALLINT: {
		uint16_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UINTEGER: {
		uint32_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::UBIGINT: {
		uint64_t dummy_value;
		return TrySimpleIntegerCast(value_ptr, value_size, dummy_value, true);
	}
	case LogicalTypeId::DOUBLE: {
		double dummy_value;
		return TryDoubleCast<double>(value_ptr, value_size, dummy_value, true, decimal_separator);
	}
	case LogicalTypeId::FLOAT: {
		float dummy_value;
		return TryDoubleCast<float>(value_ptr, value_size, dummy_value, true, decimal_separator);
	}
	case LogicalTypeId::DATE: {
		if (!dialect_options.date_format.find(LogicalTypeId::DATE)->second.GetValue().Empty()) {
			date_t result;
			string error_message;
			return dialect_options.date_format.find(LogicalTypeId::DATE)
			    ->second.GetValue()
			    .TryParseDate(value, result, error_message);
		}
		idx_t pos;
		bool special;
		date_t dummy_value;
		return Date::TryConvertDate(value_ptr, value_size, pos, dummy_value, special, true) == DateCastResult::SUCCESS;
	}
	case LogicalTypeId::TIMESTAMP: {
		timestamp_t dummy_value;
		if (!dialect_options.date_format.find(LogicalTypeId::TIMESTAMP)->second.GetValue().Empty()) {
			string error_message;
			return dialect_options.date_format.find(LogicalTypeId::TIMESTAMP)
			    ->second.GetValue()
			    .TryParseTimestamp(value, dummy_value, error_message);
		}
		return Timestamp::TryConvertTimestamp(value_ptr, value_size, dummy_value, nullptr, true) ==
		       TimestampCastResult::SUCCESS;
	}
	case LogicalTypeId::TIME: {
		idx_t pos;
		dtime_t dummy_value;
		return Time::TryConvertTime(value_ptr, value_size, pos, dummy_value, true);
	}
	case LogicalTypeId::DECIMAL: {
		uint8_t width, scale;
		type.GetDecimalProperties(width, scale);
		if (decimal_separator == ',') {
			switch (type.InternalType()) {
			case PhysicalType::INT16: {
				int16_t dummy_value;
				return TryDecimalStringCast<int16_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT32: {
				int32_t dummy_value;
				return TryDecimalStringCast<int32_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT64: {
				int64_t dummy_value;
				return TryDecimalStringCast<int64_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT128: {
				hugeint_t dummy_value;
				return TryDecimalStringCast<hugeint_t, ','>(value_ptr, value_size, dummy_value, width, scale);
			}

			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(type.InternalType()));
			}

		} else if (decimal_separator == '.') {
			switch (type.InternalType()) {
			case PhysicalType::INT16: {
				int16_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT32: {
				int32_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT64: {
				int64_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			case PhysicalType::INT128: {
				hugeint_t dummy_value;
				return TryDecimalStringCast(value_ptr, value_size, dummy_value, width, scale);
			}

			default:
				throw InternalException("Invalid Physical Type for Decimal Value. Physical Type: " +
				                        TypeIdToString(type.InternalType()));
			}
		}
		throw InvalidInputException("Decimals can only have ',' and '.' as decimal separators");
	}
	case LogicalTypeId::VARCHAR:
		return true;
	default: {
		// We do Value Try Cast for non-basic types.
		Value new_value;
		string error_message;
		Value str_value(value);
		bool success = str_value.TryCastAs(context, type, new_value, &error_message, true);
		return success && error_message.empty();
	}
	}
}